

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  bool bVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  uint uVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  ulong uVar55;
  long lVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  bool bVar61;
  ulong uVar62;
  bool bVar63;
  float fVar64;
  float fVar75;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 uVar65;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  float fVar76;
  float fVar93;
  vint4 bi_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  vint4 ai;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar138;
  float fVar153;
  float fVar154;
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar155;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar156;
  float fVar157;
  undefined1 auVar152 [32];
  float fVar158;
  undefined8 uVar159;
  float fVar179;
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar177;
  float fVar181;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar176 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  vfloat4 a0_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  float fVar234;
  vfloat4 a0_3;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar235;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  float fVar248;
  float fVar259;
  float fVar260;
  vfloat4 a0_1;
  undefined1 auVar249 [16];
  float fVar261;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  vfloat4 a0;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar262 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_669;
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5a8;
  float fStack_5a4;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  uint auStack_408 [4];
  RTCFilterFunctionNArguments local_3f8;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar56;
  undefined1 auVar118 [32];
  
  PVar3 = prim[1];
  uVar62 = (ulong)(byte)PVar3;
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar64 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  auVar127._0_4_ = fVar64 * auVar8._0_4_;
  auVar127._4_4_ = fVar64 * auVar8._4_4_;
  auVar127._8_4_ = fVar64 * auVar8._8_4_;
  auVar127._12_4_ = fVar64 * auVar8._12_4_;
  auVar139._0_4_ = fVar64 * auVar72._0_4_;
  auVar139._4_4_ = fVar64 * auVar72._4_4_;
  auVar139._8_4_ = fVar64 * auVar72._8_4_;
  auVar139._12_4_ = fVar64 * auVar72._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar276 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar276 = vcvtdq2ps_avx(auVar276);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar62 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar55 = (ulong)(uint)((int)(uVar62 * 9) * 2);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + uVar62 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar55 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar271._4_4_ = auVar139._0_4_;
  auVar271._0_4_ = auVar139._0_4_;
  auVar271._8_4_ = auVar139._0_4_;
  auVar271._12_4_ = auVar139._0_4_;
  auVar78 = vshufps_avx(auVar139,auVar139,0x55);
  auVar206 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar64 = auVar206._0_4_;
  auVar239._0_4_ = fVar64 * auVar276._0_4_;
  fVar75 = auVar206._4_4_;
  auVar239._4_4_ = fVar75 * auVar276._4_4_;
  fVar137 = auVar206._8_4_;
  auVar239._8_4_ = fVar137 * auVar276._8_4_;
  fVar153 = auVar206._12_4_;
  auVar239._12_4_ = fVar153 * auVar276._12_4_;
  auVar227._0_4_ = auVar11._0_4_ * fVar64;
  auVar227._4_4_ = auVar11._4_4_ * fVar75;
  auVar227._8_4_ = auVar11._8_4_ * fVar137;
  auVar227._12_4_ = auVar11._12_4_ * fVar153;
  auVar199._0_4_ = auVar94._0_4_ * fVar64;
  auVar199._4_4_ = auVar94._4_4_ * fVar75;
  auVar199._8_4_ = auVar94._8_4_ * fVar137;
  auVar199._12_4_ = auVar94._12_4_ * fVar153;
  auVar206 = vfmadd231ps_fma(auVar239,auVar78,auVar72);
  auVar79 = vfmadd231ps_fma(auVar227,auVar78,auVar10);
  auVar78 = vfmadd231ps_fma(auVar199,auVar66,auVar78);
  auVar109 = vfmadd231ps_fma(auVar206,auVar271,auVar8);
  auVar79 = vfmadd231ps_fma(auVar79,auVar271,auVar9);
  auVar123 = vfmadd231ps_fma(auVar78,auVar67,auVar271);
  auVar272._4_4_ = auVar127._0_4_;
  auVar272._0_4_ = auVar127._0_4_;
  auVar272._8_4_ = auVar127._0_4_;
  auVar272._12_4_ = auVar127._0_4_;
  auVar78 = vshufps_avx(auVar127,auVar127,0x55);
  auVar206 = vshufps_avx(auVar127,auVar127,0xaa);
  fVar64 = auVar206._0_4_;
  auVar140._0_4_ = fVar64 * auVar276._0_4_;
  fVar75 = auVar206._4_4_;
  auVar140._4_4_ = fVar75 * auVar276._4_4_;
  fVar137 = auVar206._8_4_;
  auVar140._8_4_ = fVar137 * auVar276._8_4_;
  fVar153 = auVar206._12_4_;
  auVar140._12_4_ = fVar153 * auVar276._12_4_;
  auVar77._0_4_ = auVar11._0_4_ * fVar64;
  auVar77._4_4_ = auVar11._4_4_ * fVar75;
  auVar77._8_4_ = auVar11._8_4_ * fVar137;
  auVar77._12_4_ = auVar11._12_4_ * fVar153;
  auVar206._0_4_ = auVar94._0_4_ * fVar64;
  auVar206._4_4_ = auVar94._4_4_ * fVar75;
  auVar206._8_4_ = auVar94._8_4_ * fVar137;
  auVar206._12_4_ = auVar94._12_4_ * fVar153;
  auVar72 = vfmadd231ps_fma(auVar140,auVar78,auVar72);
  auVar276 = vfmadd231ps_fma(auVar77,auVar78,auVar10);
  auVar10 = vfmadd231ps_fma(auVar206,auVar78,auVar66);
  auVar11 = vfmadd231ps_fma(auVar72,auVar272,auVar8);
  auVar66 = vfmadd231ps_fma(auVar276,auVar272,auVar9);
  auVar94 = vfmadd231ps_fma(auVar10,auVar272,auVar67);
  auVar186._8_4_ = 0x7fffffff;
  auVar186._0_8_ = 0x7fffffff7fffffff;
  auVar186._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar109,auVar186);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar122,1);
  auVar72 = vblendvps_avx(auVar109,auVar122,auVar8);
  auVar8 = vandps_avx(auVar79,auVar186);
  auVar8 = vcmpps_avx(auVar8,auVar122,1);
  auVar276 = vblendvps_avx(auVar79,auVar122,auVar8);
  auVar8 = vandps_avx(auVar123,auVar186);
  auVar8 = vcmpps_avx(auVar8,auVar122,1);
  auVar8 = vblendvps_avx(auVar123,auVar122,auVar8);
  auVar9 = vrcpps_avx(auVar72);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = &DAT_3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar72,auVar9,auVar187);
  auVar9 = vfmadd132ps_fma(auVar72,auVar9,auVar9);
  auVar72 = vrcpps_avx(auVar276);
  auVar276 = vfnmadd213ps_fma(auVar276,auVar72,auVar187);
  auVar10 = vfmadd132ps_fma(auVar276,auVar72,auVar72);
  auVar72 = vrcpps_avx(auVar8);
  auVar276 = vfnmadd213ps_fma(auVar8,auVar72,auVar187);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar67 = vfmadd132ps_fma(auVar276,auVar72,auVar72);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar11);
  auVar123._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar123._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar123._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar123._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar72);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar11);
  auVar141._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar141._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar141._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar141._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar79._1_3_ = 0;
  auVar79[0] = PVar3;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar72 = vpmovsxwd_avx(auVar276);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar62 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar66);
  auVar200._0_4_ = auVar8._0_4_ * auVar10._0_4_;
  auVar200._4_4_ = auVar8._4_4_ * auVar10._4_4_;
  auVar200._8_4_ = auVar8._8_4_ * auVar10._8_4_;
  auVar200._12_4_ = auVar8._12_4_ * auVar10._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar72);
  auVar8 = vsubps_avx(auVar8,auVar66);
  auVar78._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar78._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar78._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar78._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar55 + uVar62 + 6);
  auVar8 = vpmovsxwd_avx(auVar10);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar94);
  auVar109._0_4_ = auVar67._0_4_ * auVar8._0_4_;
  auVar109._4_4_ = auVar67._4_4_ * auVar8._4_4_;
  auVar109._8_4_ = auVar67._8_4_ * auVar8._8_4_;
  auVar109._12_4_ = auVar67._12_4_ * auVar8._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar62 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar94);
  auVar66._0_4_ = auVar67._0_4_ * auVar8._0_4_;
  auVar66._4_4_ = auVar67._4_4_ * auVar8._4_4_;
  auVar66._8_4_ = auVar67._8_4_ * auVar8._8_4_;
  auVar66._12_4_ = auVar67._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar123,auVar141);
  auVar72 = vpminsd_avx(auVar200,auVar78);
  auVar8 = vmaxps_avx(auVar8,auVar72);
  auVar72 = vpminsd_avx(auVar109,auVar66);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar217._4_4_ = uVar65;
  auVar217._0_4_ = uVar65;
  auVar217._8_4_ = uVar65;
  auVar217._12_4_ = uVar65;
  auVar72 = vmaxps_avx(auVar72,auVar217);
  auVar8 = vmaxps_avx(auVar8,auVar72);
  local_368._0_4_ = auVar8._0_4_ * 0.99999964;
  local_368._4_4_ = auVar8._4_4_ * 0.99999964;
  local_368._8_4_ = auVar8._8_4_ * 0.99999964;
  local_368._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar123,auVar141);
  auVar72 = vpmaxsd_avx(auVar200,auVar78);
  auVar8 = vminps_avx(auVar8,auVar72);
  auVar72 = vpmaxsd_avx(auVar109,auVar66);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar94._4_4_ = uVar65;
  auVar94._0_4_ = uVar65;
  auVar94._8_4_ = uVar65;
  auVar94._12_4_ = uVar65;
  auVar72 = vminps_avx(auVar72,auVar94);
  auVar8 = vminps_avx(auVar8,auVar72);
  auVar67._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar67._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar67._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar67._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar79[4] = PVar3;
  auVar79._5_3_ = 0;
  auVar79[8] = PVar3;
  auVar79._9_3_ = 0;
  auVar79[0xc] = PVar3;
  auVar79._13_3_ = 0;
  auVar72 = vpcmpgtd_avx(auVar79,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_368,auVar67,2);
  auVar8 = vandps_avx(auVar8,auVar72);
  uVar51 = vmovmskps_avx(auVar8);
  local_669 = uVar51 != 0;
  if (uVar51 == 0) {
    return local_669;
  }
  uVar51 = uVar51 & 0xff;
  auVar74._16_16_ = mm_lookupmask_ps._240_16_;
  auVar74._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar74,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01681c8c:
  lVar57 = 0;
  uVar62 = (ulong)uVar51;
  for (uVar55 = uVar62; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar57 = lVar57 + 1;
  }
  uVar51 = *(uint *)(prim + 2);
  local_388 = *(uint *)(prim + lVar57 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar51].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_388);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar11 = *(undefined1 (*) [16])(_Var7 + uVar55 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar55 + 1) * (long)pvVar6);
  auVar72 = *(undefined1 (*) [16])(_Var7 + (uVar55 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar55 + 3));
  fVar64 = *pfVar1;
  fVar75 = pfVar1[1];
  fVar137 = pfVar1[2];
  fVar153 = pfVar1[3];
  lVar57 = *(long *)&pGVar4[1].time_range.upper;
  auVar276 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * uVar55);
  auVar9 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * (uVar55 + 1));
  auVar10 = *(undefined1 (*) [16])(lVar57 + (long)p_Var5 * (uVar55 + 2));
  uVar62 = uVar62 - 1 & uVar62;
  pfVar1 = (float *)(lVar57 + (long)p_Var5 * (uVar55 + 3));
  fVar158 = *pfVar1;
  fVar177 = pfVar1[1];
  fVar179 = pfVar1[2];
  fVar181 = pfVar1[3];
  if (uVar62 != 0) {
    uVar60 = uVar62 - 1 & uVar62;
    for (uVar55 = uVar62; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar80._0_4_ = fVar158 * 0.0;
  auVar80._4_4_ = fVar177 * 0.0;
  auVar80._8_4_ = fVar179 * 0.0;
  auVar80._12_4_ = fVar181 * 0.0;
  auVar273._8_4_ = 0x3e2aaaab;
  auVar273._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar273._12_4_ = 0x3e2aaaab;
  auVar66 = vfmadd213ps_fma(auVar273,auVar10,auVar80);
  auVar201._8_4_ = 0x3f2aaaab;
  auVar201._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar201._12_4_ = 0x3f2aaaab;
  auVar66 = vfmadd231ps_fma(auVar66,auVar9,auVar201);
  auVar94 = vfmadd231ps_fma(auVar66,auVar276,auVar273);
  auVar68._8_4_ = 0x3f000000;
  auVar68._0_8_ = 0x3f0000003f000000;
  auVar68._12_4_ = 0x3f000000;
  auVar66 = vfmadd231ps_fma(auVar80,auVar10,auVar68);
  auVar66 = vfnmadd231ps_fma(auVar66,auVar9,ZEXT816(0) << 0x40);
  auVar206 = vfnmadd231ps_fma(auVar66,auVar276,auVar68);
  auVar249._0_4_ = fVar64 * 0.0;
  auVar249._4_4_ = fVar75 * 0.0;
  auVar249._8_4_ = fVar137 * 0.0;
  auVar249._12_4_ = fVar153 * 0.0;
  auVar66 = vfmadd213ps_fma(auVar273,auVar72,auVar249);
  auVar66 = vfmadd231ps_fma(auVar66,auVar8,auVar201);
  auVar66 = vfmadd231ps_fma(auVar66,auVar11,auVar273);
  auVar78 = vfmadd231ps_fma(auVar249,auVar72,auVar68);
  auVar78 = vfnmadd231ps_fma(auVar78,auVar8,(undefined1  [16])0x0);
  auVar79 = vfnmadd231ps_fma(auVar78,auVar11,auVar68);
  auVar110._0_4_ = fVar158 * 0.16666667;
  auVar110._4_4_ = fVar177 * 0.16666667;
  auVar110._8_4_ = fVar179 * 0.16666667;
  auVar110._12_4_ = fVar181 * 0.16666667;
  auVar78 = vfmadd231ps_fma(auVar110,auVar10,auVar201);
  auVar78 = vfmadd231ps_fma(auVar78,auVar9,auVar273);
  auVar78 = vfmadd231ps_fma(auVar78,auVar276,(undefined1  [16])0x0);
  auVar124._0_4_ = fVar158 * 0.5;
  auVar124._4_4_ = fVar177 * 0.5;
  auVar124._8_4_ = fVar179 * 0.5;
  auVar124._12_4_ = fVar181 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar124,(undefined1  [16])0x0,auVar10);
  auVar9 = vfnmadd231ps_fma(auVar10,auVar68,auVar9);
  auVar109 = vfnmadd231ps_fma(auVar9,(undefined1  [16])0x0,auVar276);
  auVar218._0_4_ = fVar64 * 0.16666667;
  auVar218._4_4_ = fVar75 * 0.16666667;
  auVar218._8_4_ = fVar137 * 0.16666667;
  auVar218._12_4_ = fVar153 * 0.16666667;
  auVar95._8_4_ = 0x3f2aaaab;
  auVar95._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar95._12_4_ = 0x3f2aaaab;
  auVar276 = vfmadd231ps_fma(auVar218,auVar72,auVar95);
  auVar276 = vfmadd231ps_fma(auVar276,auVar8,auVar273);
  auVar10 = vfmadd231ps_fma(auVar276,auVar11,(undefined1  [16])0x0);
  auVar228._0_4_ = fVar64 * 0.5;
  auVar228._4_4_ = fVar75 * 0.5;
  auVar228._8_4_ = fVar137 * 0.5;
  auVar228._12_4_ = fVar153 * 0.5;
  auVar72 = vfmadd231ps_fma(auVar228,(undefined1  [16])0x0,auVar72);
  auVar8 = vfnmadd231ps_fma(auVar72,auVar68,auVar8);
  auVar11 = vfnmadd231ps_fma(auVar8,(undefined1  [16])0x0,auVar11);
  auVar8 = vshufps_avx(auVar206,auVar206,0xc9);
  auVar72 = vshufps_avx(auVar66,auVar66,0xc9);
  fVar154 = auVar206._0_4_;
  auVar160._0_4_ = fVar154 * auVar72._0_4_;
  fVar155 = auVar206._4_4_;
  auVar160._4_4_ = fVar155 * auVar72._4_4_;
  fVar93 = auVar206._8_4_;
  auVar160._8_4_ = fVar93 * auVar72._8_4_;
  fVar76 = auVar206._12_4_;
  auVar160._12_4_ = fVar76 * auVar72._12_4_;
  auVar72 = vfmsub231ps_fma(auVar160,auVar8,auVar66);
  auVar276 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar72 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar161._0_4_ = fVar154 * auVar72._0_4_;
  auVar161._4_4_ = fVar155 * auVar72._4_4_;
  auVar161._8_4_ = fVar93 * auVar72._8_4_;
  auVar161._12_4_ = fVar76 * auVar72._12_4_;
  auVar8 = vfmsub231ps_fma(auVar161,auVar8,auVar79);
  auVar9 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar72 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar138 = auVar109._0_4_;
  auVar142._0_4_ = fVar138 * auVar72._0_4_;
  fVar121 = auVar109._4_4_;
  auVar142._4_4_ = fVar121 * auVar72._4_4_;
  fVar156 = auVar109._8_4_;
  auVar142._8_4_ = fVar156 * auVar72._8_4_;
  fVar157 = auVar109._12_4_;
  auVar142._12_4_ = fVar157 * auVar72._12_4_;
  auVar72 = vfmsub231ps_fma(auVar142,auVar8,auVar10);
  auVar10 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar72 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar188._0_4_ = fVar138 * auVar72._0_4_;
  auVar188._4_4_ = fVar121 * auVar72._4_4_;
  auVar188._8_4_ = fVar156 * auVar72._8_4_;
  auVar188._12_4_ = fVar157 * auVar72._12_4_;
  auVar8 = vfmsub231ps_fma(auVar188,auVar8,auVar11);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar276,auVar276,0x7f);
  fVar75 = auVar8._0_4_;
  auVar66 = ZEXT416((uint)fVar75);
  auVar72 = vrsqrtss_avx(auVar66,auVar66);
  fVar64 = auVar72._0_4_;
  fVar64 = fVar64 * 1.5 + fVar75 * -0.5 * fVar64 * fVar64 * fVar64;
  auVar72 = vdpps_avx(auVar276,auVar9,0x7f);
  fVar158 = auVar276._0_4_ * fVar64;
  fVar177 = auVar276._4_4_ * fVar64;
  fVar179 = auVar276._8_4_ * fVar64;
  fVar181 = auVar276._12_4_ * fVar64;
  auVar240._0_4_ = auVar9._0_4_ * fVar75;
  auVar240._4_4_ = auVar9._4_4_ * fVar75;
  auVar240._8_4_ = auVar9._8_4_ * fVar75;
  auVar240._12_4_ = auVar9._12_4_ * fVar75;
  fVar75 = auVar72._0_4_;
  auVar202._0_4_ = auVar276._0_4_ * fVar75;
  auVar202._4_4_ = auVar276._4_4_ * fVar75;
  auVar202._8_4_ = auVar276._8_4_ * fVar75;
  auVar202._12_4_ = auVar276._12_4_ * fVar75;
  auVar276 = vsubps_avx(auVar240,auVar202);
  auVar72 = vrcpss_avx(auVar66,auVar66);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar72,SUB6416(ZEXT464(0x40000000),0));
  fVar137 = auVar72._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar153 = auVar8._0_4_;
  auVar66 = ZEXT416((uint)fVar153);
  auVar72 = vrsqrtss_avx(auVar66,auVar66);
  fVar75 = auVar72._0_4_;
  auVar72 = vdpps_avx(auVar10,auVar11,0x7f);
  fVar75 = fVar75 * 1.5 + fVar153 * -0.5 * fVar75 * fVar75 * fVar75;
  fVar248 = fVar75 * auVar10._0_4_;
  fVar259 = fVar75 * auVar10._4_4_;
  fVar260 = fVar75 * auVar10._8_4_;
  fVar261 = fVar75 * auVar10._12_4_;
  auVar189._0_4_ = fVar153 * auVar11._0_4_;
  auVar189._4_4_ = fVar153 * auVar11._4_4_;
  auVar189._8_4_ = fVar153 * auVar11._8_4_;
  auVar189._12_4_ = fVar153 * auVar11._12_4_;
  fVar153 = auVar72._0_4_;
  auVar143._0_4_ = fVar153 * auVar10._0_4_;
  auVar143._4_4_ = fVar153 * auVar10._4_4_;
  auVar143._8_4_ = fVar153 * auVar10._8_4_;
  auVar143._12_4_ = fVar153 * auVar10._12_4_;
  auVar9 = vsubps_avx(auVar189,auVar143);
  auVar72 = vrcpss_avx(auVar66,auVar66);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar72,ZEXT416(0x40000000));
  fVar153 = auVar8._0_4_ * auVar72._0_4_;
  auVar8 = vshufps_avx(auVar94,auVar94,0xff);
  auVar219._0_4_ = auVar8._0_4_ * fVar158;
  auVar219._4_4_ = auVar8._4_4_ * fVar177;
  auVar219._8_4_ = auVar8._8_4_ * fVar179;
  auVar219._12_4_ = auVar8._12_4_ * fVar181;
  local_4a8 = vsubps_avx(auVar94,auVar219);
  auVar72 = vshufps_avx(auVar206,auVar206,0xff);
  auVar162._0_4_ = auVar72._0_4_ * fVar158 + fVar64 * auVar276._0_4_ * fVar137 * auVar8._0_4_;
  auVar162._4_4_ = auVar72._4_4_ * fVar177 + fVar64 * auVar276._4_4_ * fVar137 * auVar8._4_4_;
  auVar162._8_4_ = auVar72._8_4_ * fVar179 + fVar64 * auVar276._8_4_ * fVar137 * auVar8._8_4_;
  auVar162._12_4_ = auVar72._12_4_ * fVar181 + fVar64 * auVar276._12_4_ * fVar137 * auVar8._12_4_;
  auVar276 = vsubps_avx(auVar206,auVar162);
  local_4b8._0_4_ = auVar94._0_4_ + auVar219._0_4_;
  local_4b8._4_4_ = auVar94._4_4_ + auVar219._4_4_;
  fStack_4b0 = auVar94._8_4_ + auVar219._8_4_;
  fStack_4ac = auVar94._12_4_ + auVar219._12_4_;
  auVar8 = vshufps_avx(auVar78,auVar78,0xff);
  auVar96._0_4_ = fVar248 * auVar8._0_4_;
  auVar96._4_4_ = fVar259 * auVar8._4_4_;
  auVar96._8_4_ = fVar260 * auVar8._8_4_;
  auVar96._12_4_ = fVar261 * auVar8._12_4_;
  local_4c8 = vsubps_avx(auVar78,auVar96);
  auVar72 = vshufps_avx(auVar109,auVar109,0xff);
  auVar81._0_4_ = fVar248 * auVar72._0_4_ + auVar8._0_4_ * fVar75 * auVar9._0_4_ * fVar153;
  auVar81._4_4_ = fVar259 * auVar72._4_4_ + auVar8._4_4_ * fVar75 * auVar9._4_4_ * fVar153;
  auVar81._8_4_ = fVar260 * auVar72._8_4_ + auVar8._8_4_ * fVar75 * auVar9._8_4_ * fVar153;
  auVar81._12_4_ = fVar261 * auVar72._12_4_ + auVar8._12_4_ * fVar75 * auVar9._12_4_ * fVar153;
  auVar8 = vsubps_avx(auVar109,auVar81);
  fVar158 = auVar78._0_4_ + auVar96._0_4_;
  fVar177 = auVar78._4_4_ + auVar96._4_4_;
  fVar179 = auVar78._8_4_ + auVar96._8_4_;
  fVar181 = auVar78._12_4_ + auVar96._12_4_;
  local_4d8._0_4_ = local_4a8._0_4_ + auVar276._0_4_ * 0.33333334;
  local_4d8._4_4_ = local_4a8._4_4_ + auVar276._4_4_ * 0.33333334;
  local_4d8._8_4_ = local_4a8._8_4_ + auVar276._8_4_ * 0.33333334;
  local_4d8._12_4_ = local_4a8._12_4_ + auVar276._12_4_ * 0.33333334;
  auVar82._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar82._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar82._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar82._12_4_ = auVar8._12_4_ * 0.33333334;
  local_4e8 = vsubps_avx(local_4c8,auVar82);
  local_488 = vsubps_avx(local_4a8,auVar67);
  auVar8 = vshufps_avx(local_488,local_488,0x55);
  auVar72 = vshufps_avx(local_488,local_488,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar64 = pre->ray_space[k].vz.field_0.m128[0];
  fVar75 = pre->ray_space[k].vz.field_0.m128[1];
  fVar137 = pre->ray_space[k].vz.field_0.m128[2];
  fVar153 = pre->ray_space[k].vz.field_0.m128[3];
  auVar83._0_4_ = fVar64 * auVar72._0_4_;
  auVar83._4_4_ = fVar75 * auVar72._4_4_;
  auVar83._8_4_ = fVar137 * auVar72._8_4_;
  auVar83._12_4_ = fVar153 * auVar72._12_4_;
  auVar276 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar8);
  local_498 = vsubps_avx(local_4d8,auVar67);
  auVar8 = vshufps_avx(local_498,local_498,0x55);
  auVar72 = vshufps_avx(local_498,local_498,0xaa);
  auVar281._0_4_ = fVar64 * auVar72._0_4_;
  auVar281._4_4_ = fVar75 * auVar72._4_4_;
  auVar281._8_4_ = fVar137 * auVar72._8_4_;
  auVar281._12_4_ = fVar153 * auVar72._12_4_;
  auVar72 = vfmadd231ps_fma(auVar281,(undefined1  [16])aVar2,auVar8);
  local_2f8 = vsubps_avx(local_4e8,auVar67);
  auVar8 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar250._0_4_ = fVar64 * auVar8._0_4_;
  auVar250._4_4_ = fVar75 * auVar8._4_4_;
  auVar250._8_4_ = fVar137 * auVar8._8_4_;
  auVar250._12_4_ = fVar153 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar9 = vfmadd231ps_fma(auVar250,(undefined1  [16])aVar2,auVar8);
  local_308 = vsubps_avx(local_4c8,auVar67);
  auVar8 = vshufps_avx(local_308,local_308,0xaa);
  auVar274._0_4_ = fVar64 * auVar8._0_4_;
  auVar274._4_4_ = fVar75 * auVar8._4_4_;
  auVar274._8_4_ = fVar137 * auVar8._8_4_;
  auVar274._12_4_ = fVar153 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_308,local_308,0x55);
  auVar10 = vfmadd231ps_fma(auVar274,(undefined1  [16])aVar2,auVar8);
  local_318 = vsubps_avx(_local_4b8,auVar67);
  auVar8 = vshufps_avx(local_318,local_318,0xaa);
  auVar144._0_4_ = fVar64 * auVar8._0_4_;
  auVar144._4_4_ = fVar75 * auVar8._4_4_;
  auVar144._8_4_ = fVar137 * auVar8._8_4_;
  auVar144._12_4_ = fVar153 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_318,local_318,0x55);
  auVar11 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar2,auVar8);
  local_4f8._0_4_ = (fVar154 + auVar162._0_4_) * 0.33333334 + (float)local_4b8._0_4_;
  local_4f8._4_4_ = (fVar155 + auVar162._4_4_) * 0.33333334 + (float)local_4b8._4_4_;
  fStack_4f0 = (fVar93 + auVar162._8_4_) * 0.33333334 + fStack_4b0;
  fStack_4ec = (fVar76 + auVar162._12_4_) * 0.33333334 + fStack_4ac;
  local_328 = vsubps_avx(_local_4f8,auVar67);
  auVar8 = vshufps_avx(local_328,local_328,0xaa);
  auVar203._0_4_ = auVar8._0_4_ * fVar64;
  auVar203._4_4_ = auVar8._4_4_ * fVar75;
  auVar203._8_4_ = auVar8._8_4_ * fVar137;
  auVar203._12_4_ = auVar8._12_4_ * fVar153;
  auVar8 = vshufps_avx(local_328,local_328,0x55);
  auVar66 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar8);
  auVar220._0_4_ = (fVar138 + auVar81._0_4_) * 0.33333334;
  auVar220._4_4_ = (fVar121 + auVar81._4_4_) * 0.33333334;
  auVar220._8_4_ = (fVar156 + auVar81._8_4_) * 0.33333334;
  auVar220._12_4_ = (fVar157 + auVar81._12_4_) * 0.33333334;
  auVar44._4_4_ = fVar177;
  auVar44._0_4_ = fVar158;
  auVar44._8_4_ = fVar179;
  auVar44._12_4_ = fVar181;
  _local_508 = vsubps_avx(auVar44,auVar220);
  local_338 = vsubps_avx(_local_508,auVar67);
  auVar8 = vshufps_avx(local_338,local_338,0xaa);
  auVar221._0_4_ = auVar8._0_4_ * fVar64;
  auVar221._4_4_ = auVar8._4_4_ * fVar75;
  auVar221._8_4_ = auVar8._8_4_ * fVar137;
  auVar221._12_4_ = auVar8._12_4_ * fVar153;
  auVar8 = vshufps_avx(local_338,local_338,0x55);
  auVar94 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar2,auVar8);
  local_348 = vsubps_avx(auVar44,auVar67);
  auVar8 = vshufps_avx(local_348,local_348,0xaa);
  auVar69._0_4_ = fVar64 * auVar8._0_4_;
  auVar69._4_4_ = fVar75 * auVar8._4_4_;
  auVar69._8_4_ = fVar137 * auVar8._8_4_;
  auVar69._12_4_ = fVar153 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_348,local_348,0x55);
  auVar8 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar8);
  auVar163._4_4_ = local_488._0_4_;
  auVar163._0_4_ = local_488._0_4_;
  auVar163._8_4_ = local_488._0_4_;
  auVar163._12_4_ = local_488._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar67 = vfmadd231ps_fma(auVar276,(undefined1  [16])aVar2,auVar163);
  auVar164._4_4_ = local_498._0_4_;
  auVar164._0_4_ = local_498._0_4_;
  auVar164._8_4_ = local_498._0_4_;
  auVar164._12_4_ = local_498._0_4_;
  auVar78 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar164);
  uVar65 = local_2f8._0_4_;
  auVar165._4_4_ = uVar65;
  auVar165._0_4_ = uVar65;
  auVar165._8_4_ = uVar65;
  auVar165._12_4_ = uVar65;
  auVar206 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar165);
  uVar65 = local_308._0_4_;
  auVar166._4_4_ = uVar65;
  auVar166._0_4_ = uVar65;
  auVar166._8_4_ = uVar65;
  auVar166._12_4_ = uVar65;
  auVar79 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar166);
  uVar65 = local_318._0_4_;
  auVar167._4_4_ = uVar65;
  auVar167._0_4_ = uVar65;
  auVar167._8_4_ = uVar65;
  auVar167._12_4_ = uVar65;
  auVar109 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar167);
  uVar65 = local_328._0_4_;
  auVar168._4_4_ = uVar65;
  auVar168._0_4_ = uVar65;
  auVar168._8_4_ = uVar65;
  auVar168._12_4_ = uVar65;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar168);
  uVar65 = local_338._0_4_;
  auVar169._4_4_ = uVar65;
  auVar169._0_4_ = uVar65;
  auVar169._8_4_ = uVar65;
  auVar169._12_4_ = uVar65;
  auVar94 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar2,auVar169);
  uVar65 = local_348._0_4_;
  auVar170._4_4_ = uVar65;
  auVar170._0_4_ = uVar65;
  auVar170._8_4_ = uVar65;
  auVar170._12_4_ = uVar65;
  auVar123 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar170);
  auVar9 = vmovlhps_avx(auVar67,auVar109);
  auVar10 = vmovlhps_avx(auVar78,auVar66);
  auVar11 = vmovlhps_avx(auVar206,auVar94);
  _local_2e8 = vmovlhps_avx(auVar79,auVar123);
  auVar8 = vminps_avx(auVar9,auVar10);
  auVar72 = vminps_avx(auVar11,_local_2e8);
  auVar276 = vminps_avx(auVar8,auVar72);
  auVar8 = vmaxps_avx(auVar9,auVar10);
  auVar72 = vmaxps_avx(auVar11,_local_2e8);
  auVar8 = vmaxps_avx(auVar8,auVar72);
  auVar72 = vshufpd_avx(auVar276,auVar276,3);
  auVar276 = vminps_avx(auVar276,auVar72);
  auVar72 = vshufpd_avx(auVar8,auVar8,3);
  auVar72 = vmaxps_avx(auVar8,auVar72);
  auVar8 = vandps_avx(auVar186,auVar276);
  auVar72 = vandps_avx(auVar186,auVar72);
  auVar8 = vmaxps_avx(auVar8,auVar72);
  auVar72 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar72,auVar8);
  fVar75 = auVar8._0_4_ * 9.536743e-07;
  auVar262._8_8_ = auVar67._0_8_;
  auVar262._0_8_ = auVar67._0_8_;
  local_418._8_8_ = auVar78._0_8_;
  local_418._0_8_ = auVar78._0_8_;
  local_428._0_8_ = auVar206._0_8_;
  local_428._8_8_ = local_428._0_8_;
  local_438._8_8_ = auVar79._0_8_;
  local_438._0_8_ = auVar79._0_8_;
  local_448 = auVar109._0_8_;
  register0x00001348 = local_448;
  register0x000013c8 = auVar66._0_8_;
  local_458 = auVar66._0_8_;
  register0x00001408 = auVar94._0_8_;
  local_468 = auVar94._0_8_;
  register0x00001448 = auVar123._0_8_;
  local_478 = auVar123._0_8_;
  local_198 = fVar75;
  fStack_194 = fVar75;
  fStack_190 = fVar75;
  fStack_18c = fVar75;
  fStack_188 = fVar75;
  fStack_184 = fVar75;
  fStack_180 = fVar75;
  fStack_17c = fVar75;
  local_1b8 = -fVar75;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_378 = uVar51;
  uStack_374 = uVar51;
  uStack_370 = uVar51;
  uStack_36c = uVar51;
  uStack_384 = local_388;
  uStack_380 = local_388;
  uStack_37c = local_388;
  bVar61 = false;
  uVar55 = 0;
  fVar64 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(auVar10,auVar9);
  local_2c8 = vsubps_avx(auVar11,auVar10);
  local_2d8 = vsubps_avx(_local_2e8,auVar11);
  local_398 = vsubps_avx(_local_4b8,local_4a8);
  local_3a8 = vsubps_avx(_local_4f8,local_4d8);
  local_3b8 = vsubps_avx(_local_508,local_4e8);
  auVar45._4_4_ = fVar177;
  auVar45._0_4_ = fVar158;
  auVar45._8_4_ = fVar179;
  auVar45._12_4_ = fVar181;
  _local_3c8 = vsubps_avx(auVar45,local_4c8);
  local_358 = ZEXT816(0x3f80000000000000);
  auVar287 = ZEXT1664(local_358);
  do {
    auVar139 = auVar287._0_16_;
    auVar8 = vshufps_avx(auVar139,auVar139,0x50);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = &DAT_3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._0_16_ = auVar111;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar72 = vsubps_avx(auVar111,auVar8);
    fVar137 = auVar8._0_4_;
    auVar70._0_4_ = local_448._0_4_ * fVar137;
    fVar153 = auVar8._4_4_;
    auVar70._4_4_ = local_448._4_4_ * fVar153;
    fVar154 = auVar8._8_4_;
    auVar70._8_4_ = local_448._8_4_ * fVar154;
    fVar155 = auVar8._12_4_;
    auVar70._12_4_ = local_448._12_4_ * fVar155;
    auVar145._0_4_ = local_458._0_4_ * fVar137;
    auVar145._4_4_ = local_458._4_4_ * fVar153;
    auVar145._8_4_ = local_458._8_4_ * fVar154;
    auVar145._12_4_ = local_458._12_4_ * fVar155;
    auVar190._0_4_ = local_468._0_4_ * fVar137;
    auVar190._4_4_ = local_468._4_4_ * fVar153;
    auVar190._8_4_ = local_468._8_4_ * fVar154;
    auVar190._12_4_ = local_468._12_4_ * fVar155;
    auVar275._0_4_ = local_478._0_4_ * fVar137;
    auVar275._4_4_ = local_478._4_4_ * fVar153;
    auVar275._8_4_ = local_478._8_4_ * fVar154;
    auVar275._12_4_ = local_478._12_4_ * fVar155;
    auVar66 = vfmadd231ps_fma(auVar70,auVar72,auVar262);
    auVar94 = vfmadd231ps_fma(auVar145,auVar72,local_418);
    auVar78 = vfmadd231ps_fma(auVar190,auVar72,local_428);
    auVar206 = vfmadd231ps_fma(auVar275,local_438,auVar72);
    auVar8 = vmovshdup_avx(local_358);
    fVar137 = local_358._0_4_;
    fVar93 = (auVar8._0_4_ - fVar137) * 0.04761905;
    auVar216._4_4_ = fVar137;
    auVar216._0_4_ = fVar137;
    auVar216._8_4_ = fVar137;
    auVar216._12_4_ = fVar137;
    auVar216._16_4_ = fVar137;
    auVar216._20_4_ = fVar137;
    auVar216._24_4_ = fVar137;
    auVar216._28_4_ = fVar137;
    auVar106._0_8_ = auVar8._0_8_;
    auVar106._8_8_ = auVar106._0_8_;
    auVar106._16_8_ = auVar106._0_8_;
    auVar106._24_8_ = auVar106._0_8_;
    auVar74 = vsubps_avx(auVar106,auVar216);
    uVar65 = auVar66._0_4_;
    auVar286._4_4_ = uVar65;
    auVar286._0_4_ = uVar65;
    auVar286._8_4_ = uVar65;
    auVar286._12_4_ = uVar65;
    auVar286._16_4_ = uVar65;
    auVar286._20_4_ = uVar65;
    auVar286._24_4_ = uVar65;
    auVar286._28_4_ = uVar65;
    auVar8 = vmovshdup_avx(auVar66);
    uVar159 = auVar8._0_8_;
    auVar269._8_8_ = uVar159;
    auVar269._0_8_ = uVar159;
    auVar269._16_8_ = uVar159;
    auVar269._24_8_ = uVar159;
    fVar76 = auVar94._0_4_;
    auVar91._4_4_ = fVar76;
    auVar91._0_4_ = fVar76;
    auVar91._8_4_ = fVar76;
    auVar91._12_4_ = fVar76;
    auVar91._16_4_ = fVar76;
    auVar91._20_4_ = fVar76;
    auVar91._24_4_ = fVar76;
    auVar91._28_4_ = fVar76;
    auVar72 = vmovshdup_avx(auVar94);
    auVar174._0_8_ = auVar72._0_8_;
    auVar174._8_8_ = auVar174._0_8_;
    auVar174._16_8_ = auVar174._0_8_;
    auVar174._24_8_ = auVar174._0_8_;
    fVar156 = auVar78._0_4_;
    auVar247._4_4_ = fVar156;
    auVar247._0_4_ = fVar156;
    auVar247._8_4_ = fVar156;
    auVar247._12_4_ = fVar156;
    auVar247._16_4_ = fVar156;
    auVar247._20_4_ = fVar156;
    auVar247._24_4_ = fVar156;
    auVar247._28_4_ = fVar156;
    auVar276 = vmovshdup_avx(auVar78);
    auVar226._0_8_ = auVar276._0_8_;
    auVar226._8_8_ = auVar226._0_8_;
    auVar226._16_8_ = auVar226._0_8_;
    auVar226._24_8_ = auVar226._0_8_;
    local_5a8 = auVar206._0_4_;
    auVar67 = vmovshdup_avx(auVar206);
    auVar79 = vfmadd132ps_fma(auVar74,auVar216,_DAT_02020f20);
    auVar74 = vsubps_avx(auVar118,ZEXT1632(auVar79));
    fVar137 = auVar79._0_4_;
    auVar278._0_4_ = fVar76 * fVar137;
    fVar153 = auVar79._4_4_;
    auVar278._4_4_ = fVar76 * fVar153;
    fVar154 = auVar79._8_4_;
    auVar278._8_4_ = fVar76 * fVar154;
    fVar155 = auVar79._12_4_;
    auVar278._12_4_ = fVar76 * fVar155;
    auVar278._16_4_ = fVar76 * 0.0;
    auVar278._20_4_ = fVar76 * 0.0;
    auVar278._24_4_ = fVar76 * 0.0;
    auVar278._28_4_ = 0;
    auVar79 = vfmadd231ps_fma(auVar278,auVar74,auVar286);
    fVar138 = auVar72._0_4_;
    auVar256._0_4_ = fVar138 * fVar137;
    fVar121 = auVar72._4_4_;
    auVar256._4_4_ = fVar121 * fVar153;
    auVar256._8_4_ = fVar138 * fVar154;
    auVar256._12_4_ = fVar121 * fVar155;
    auVar256._16_4_ = fVar138 * 0.0;
    auVar256._20_4_ = fVar121 * 0.0;
    auVar256._24_4_ = fVar138 * 0.0;
    auVar256._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(auVar256,auVar74,auVar269);
    auVar12._4_4_ = fVar156 * fVar153;
    auVar12._0_4_ = fVar156 * fVar137;
    auVar12._8_4_ = fVar156 * fVar154;
    auVar12._12_4_ = fVar156 * fVar155;
    auVar12._16_4_ = fVar156 * 0.0;
    auVar12._20_4_ = fVar156 * 0.0;
    auVar12._24_4_ = fVar156 * 0.0;
    auVar12._28_4_ = auVar8._4_4_;
    auVar123 = vfmadd231ps_fma(auVar12,auVar74,auVar91);
    fVar138 = auVar276._0_4_;
    fVar121 = auVar276._4_4_;
    auVar13._4_4_ = fVar121 * fVar153;
    auVar13._0_4_ = fVar138 * fVar137;
    auVar13._8_4_ = fVar138 * fVar154;
    auVar13._12_4_ = fVar121 * fVar155;
    auVar13._16_4_ = fVar138 * 0.0;
    auVar13._20_4_ = fVar121 * 0.0;
    auVar13._24_4_ = fVar138 * 0.0;
    auVar13._28_4_ = uVar65;
    auVar127 = vfmadd231ps_fma(auVar13,auVar74,auVar174);
    auVar8 = vshufps_avx(auVar66,auVar66,0xaa);
    auVar175._0_8_ = auVar8._0_8_;
    auVar175._8_8_ = auVar175._0_8_;
    auVar175._16_8_ = auVar175._0_8_;
    auVar175._24_8_ = auVar175._0_8_;
    auVar72 = vshufps_avx(auVar66,auVar66,0xff);
    uStack_5f0 = auVar72._0_8_;
    local_5f8 = (undefined1  [8])uStack_5f0;
    uStack_5e8 = uStack_5f0;
    uStack_5e0 = uStack_5f0;
    auVar14._4_4_ = fVar153 * local_5a8;
    auVar14._0_4_ = fVar137 * local_5a8;
    auVar14._8_4_ = fVar154 * local_5a8;
    auVar14._12_4_ = fVar155 * local_5a8;
    auVar14._16_4_ = local_5a8 * 0.0;
    auVar14._20_4_ = local_5a8 * 0.0;
    auVar14._24_4_ = local_5a8 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar77 = vfmadd231ps_fma(auVar14,auVar74,auVar247);
    auVar276 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar135._0_8_ = auVar276._0_8_;
    auVar135._8_8_ = auVar135._0_8_;
    auVar135._16_8_ = auVar135._0_8_;
    auVar135._24_8_ = auVar135._0_8_;
    auVar66 = vshufps_avx(auVar94,auVar94,0xff);
    auVar152._0_8_ = auVar66._0_8_;
    auVar152._8_8_ = auVar152._0_8_;
    auVar152._16_8_ = auVar152._0_8_;
    auVar152._24_8_ = auVar152._0_8_;
    fVar138 = auVar67._0_4_;
    fVar121 = auVar67._4_4_;
    auVar15._4_4_ = fVar121 * fVar153;
    auVar15._0_4_ = fVar138 * fVar137;
    auVar15._8_4_ = fVar138 * fVar154;
    auVar15._12_4_ = fVar121 * fVar155;
    auVar15._16_4_ = fVar138 * 0.0;
    auVar15._20_4_ = fVar121 * 0.0;
    auVar15._24_4_ = fVar138 * 0.0;
    auVar15._28_4_ = fVar156;
    auVar122 = vfmadd231ps_fma(auVar15,auVar74,auVar226);
    auVar16._28_4_ = fVar76;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar155,
                            CONCAT48(auVar123._8_4_ * fVar154,
                                     CONCAT44(auVar123._4_4_ * fVar153,auVar123._0_4_ * fVar137))));
    auVar79 = vfmadd231ps_fma(auVar16,auVar74,ZEXT1632(auVar79));
    auVar17._28_4_ = auVar72._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar127._12_4_ * fVar155,
                            CONCAT48(auVar127._8_4_ * fVar154,
                                     CONCAT44(auVar127._4_4_ * fVar153,auVar127._0_4_ * fVar137))));
    auVar109 = vfmadd231ps_fma(auVar17,auVar74,ZEXT1632(auVar109));
    auVar72 = vshufps_avx(auVar78,auVar78,0xaa);
    uVar159 = auVar72._0_8_;
    auVar257._8_8_ = uVar159;
    auVar257._0_8_ = uVar159;
    auVar257._16_8_ = uVar159;
    auVar257._24_8_ = uVar159;
    auVar67 = vshufps_avx(auVar78,auVar78,0xff);
    uVar159 = auVar67._0_8_;
    auVar279._8_8_ = uVar159;
    auVar279._0_8_ = uVar159;
    auVar279._16_8_ = uVar159;
    auVar279._24_8_ = uVar159;
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar77._12_4_,
                                                  CONCAT48(fVar154 * auVar77._8_4_,
                                                           CONCAT44(fVar153 * auVar77._4_4_,
                                                                    fVar137 * auVar77._0_4_)))),
                               auVar74,ZEXT1632(auVar123));
    auVar94 = vshufps_avx(auVar206,auVar206,0xaa);
    auVar78 = vshufps_avx(auVar206,auVar206,0xff);
    local_5a8 = auVar78._0_4_;
    fStack_5a4 = auVar78._4_4_;
    auVar18._28_4_ = fStack_5a4;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar122._12_4_ * fVar155,
                            CONCAT48(auVar122._8_4_ * fVar154,
                                     CONCAT44(auVar122._4_4_ * fVar153,auVar122._0_4_ * fVar137))));
    auVar78 = vfmadd231ps_fma(auVar18,auVar74,ZEXT1632(auVar127));
    auVar206 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar123._12_4_,
                                                  CONCAT48(fVar154 * auVar123._8_4_,
                                                           CONCAT44(fVar153 * auVar123._4_4_,
                                                                    fVar137 * auVar123._0_4_)))),
                               auVar74,ZEXT1632(auVar79));
    auVar12 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar79));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar78._12_4_,
                                                 CONCAT48(fVar154 * auVar78._8_4_,
                                                          CONCAT44(fVar153 * auVar78._4_4_,
                                                                   fVar137 * auVar78._0_4_)))),
                              auVar74,ZEXT1632(auVar109));
    auVar13 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar109));
    fVar259 = fVar93 * auVar12._0_4_ * 3.0;
    fVar261 = fVar93 * auVar12._4_4_ * 3.0;
    auVar258._4_4_ = fVar261;
    auVar258._0_4_ = fVar259;
    fVar234 = fVar93 * auVar12._8_4_ * 3.0;
    auVar258._8_4_ = fVar234;
    fVar235 = fVar93 * auVar12._12_4_ * 3.0;
    auVar258._12_4_ = fVar235;
    fVar236 = fVar93 * auVar12._16_4_ * 3.0;
    auVar258._16_4_ = fVar236;
    fVar237 = fVar93 * auVar12._20_4_ * 3.0;
    auVar258._20_4_ = fVar237;
    fVar238 = fVar93 * auVar12._24_4_ * 3.0;
    auVar258._24_4_ = fVar238;
    auVar258._28_4_ = 0x40400000;
    local_5d8._0_4_ = fVar93 * auVar13._0_4_ * 3.0;
    local_5d8._4_4_ = fVar93 * auVar13._4_4_ * 3.0;
    fStack_5d0 = fVar93 * auVar13._8_4_ * 3.0;
    fStack_5cc = fVar93 * auVar13._12_4_ * 3.0;
    fStack_5c8 = fVar93 * auVar13._16_4_ * 3.0;
    fStack_5c4 = fVar93 * auVar13._20_4_ * 3.0;
    fStack_5c0 = fVar93 * auVar13._24_4_ * 3.0;
    fStack_5bc = auVar13._28_4_;
    fVar76 = auVar276._0_4_;
    fVar138 = auVar276._4_4_;
    auVar19._4_4_ = fVar138 * fVar153;
    auVar19._0_4_ = fVar76 * fVar137;
    auVar19._8_4_ = fVar76 * fVar154;
    auVar19._12_4_ = fVar138 * fVar155;
    auVar19._16_4_ = fVar76 * 0.0;
    auVar19._20_4_ = fVar138 * 0.0;
    auVar19._24_4_ = fVar76 * 0.0;
    auVar19._28_4_ = auVar12._28_4_;
    auVar276 = vfmadd231ps_fma(auVar19,auVar74,auVar175);
    fVar76 = auVar66._0_4_;
    fVar121 = auVar66._4_4_;
    auVar20._4_4_ = fVar121 * fVar153;
    auVar20._0_4_ = fVar76 * fVar137;
    auVar20._8_4_ = fVar76 * fVar154;
    auVar20._12_4_ = fVar121 * fVar155;
    auVar20._16_4_ = fVar76 * 0.0;
    auVar20._20_4_ = fVar121 * 0.0;
    auVar20._24_4_ = fVar76 * 0.0;
    auVar20._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar20,auVar74,_local_5f8);
    fVar76 = auVar72._0_4_;
    fVar121 = auVar72._4_4_;
    auVar21._4_4_ = fVar121 * fVar153;
    auVar21._0_4_ = fVar76 * fVar137;
    auVar21._8_4_ = fVar76 * fVar154;
    auVar21._12_4_ = fVar121 * fVar155;
    auVar21._16_4_ = fVar76 * 0.0;
    auVar21._20_4_ = fVar121 * 0.0;
    auVar21._24_4_ = fVar76 * 0.0;
    auVar21._28_4_ = fVar93;
    auVar72 = vfmadd231ps_fma(auVar21,auVar74,auVar135);
    fVar76 = auVar67._0_4_;
    fVar156 = auVar67._4_4_;
    auVar22._4_4_ = fVar156 * fVar153;
    auVar22._0_4_ = fVar76 * fVar137;
    auVar22._8_4_ = fVar76 * fVar154;
    auVar22._12_4_ = fVar156 * fVar155;
    auVar22._16_4_ = fVar76 * 0.0;
    auVar22._20_4_ = fVar156 * 0.0;
    auVar22._24_4_ = fVar76 * 0.0;
    auVar22._28_4_ = fVar138;
    auVar67 = vfmadd231ps_fma(auVar22,auVar74,auVar152);
    local_2a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar206));
    fVar76 = auVar94._0_4_;
    fVar138 = auVar94._4_4_;
    auVar23._4_4_ = fVar138 * fVar153;
    auVar23._0_4_ = fVar76 * fVar137;
    auVar23._8_4_ = fVar76 * fVar154;
    auVar23._12_4_ = fVar138 * fVar155;
    auVar23._16_4_ = fVar76 * 0.0;
    auVar23._20_4_ = fVar138 * 0.0;
    auVar23._24_4_ = fVar76 * 0.0;
    auVar23._28_4_ = local_2a8._28_4_;
    auVar66 = vfmadd231ps_fma(auVar23,auVar74,auVar257);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar79));
    auVar24._4_4_ = fVar153 * fStack_5a4;
    auVar24._0_4_ = fVar137 * local_5a8;
    auVar24._8_4_ = fVar154 * local_5a8;
    auVar24._12_4_ = fVar155 * fStack_5a4;
    auVar24._16_4_ = local_5a8 * 0.0;
    auVar24._20_4_ = fStack_5a4 * 0.0;
    auVar24._24_4_ = local_5a8 * 0.0;
    auVar24._28_4_ = fVar121;
    auVar94 = vfmadd231ps_fma(auVar24,auVar74,auVar279);
    auVar25._28_4_ = fVar138;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar155 * auVar72._12_4_,
                            CONCAT48(fVar154 * auVar72._8_4_,
                                     CONCAT44(fVar153 * auVar72._4_4_,fVar137 * auVar72._0_4_))));
    auVar276 = vfmadd231ps_fma(auVar25,auVar74,ZEXT1632(auVar276));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar67._12_4_,
                                                CONCAT48(fVar154 * auVar67._8_4_,
                                                         CONCAT44(fVar153 * auVar67._4_4_,
                                                                  fVar137 * auVar67._0_4_)))),
                             auVar74,ZEXT1632(auVar8));
    fVar259 = auVar206._0_4_ + fVar259;
    fVar261 = auVar206._4_4_ + fVar261;
    fVar234 = auVar206._8_4_ + fVar234;
    fVar235 = auVar206._12_4_ + fVar235;
    fVar236 = fVar236 + 0.0;
    fVar237 = fVar237 + 0.0;
    fVar238 = fVar238 + 0.0;
    auVar26._28_4_ = 0x40400000;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar94._12_4_ * fVar155,
                            CONCAT48(auVar94._8_4_ * fVar154,
                                     CONCAT44(auVar94._4_4_ * fVar153,auVar94._0_4_ * fVar137))));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar66._12_4_,
                                                 CONCAT48(fVar154 * auVar66._8_4_,
                                                          CONCAT44(fVar153 * auVar66._4_4_,
                                                                   fVar137 * auVar66._0_4_)))),
                              auVar74,ZEXT1632(auVar72));
    auVar67 = vfmadd231ps_fma(auVar26,auVar74,ZEXT1632(auVar67));
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar72._12_4_,
                                                 CONCAT48(fVar154 * auVar72._8_4_,
                                                          CONCAT44(fVar153 * auVar72._4_4_,
                                                                   fVar137 * auVar72._0_4_)))),
                              auVar74,ZEXT1632(auVar276));
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar67._12_4_,
                                                 CONCAT48(fVar154 * auVar67._8_4_,
                                                          CONCAT44(fVar153 * auVar67._4_4_,
                                                                   fVar137 * auVar67._0_4_)))),
                              ZEXT1632(auVar8),auVar74);
    auVar74 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar276));
    auVar12 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar8));
    fVar137 = fVar93 * auVar74._0_4_ * 3.0;
    fVar153 = fVar93 * auVar74._4_4_ * 3.0;
    auVar27._4_4_ = fVar153;
    auVar27._0_4_ = fVar137;
    fVar154 = fVar93 * auVar74._8_4_ * 3.0;
    auVar27._8_4_ = fVar154;
    fVar155 = fVar93 * auVar74._12_4_ * 3.0;
    auVar27._12_4_ = fVar155;
    fVar156 = fVar93 * auVar74._16_4_ * 3.0;
    auVar27._16_4_ = fVar156;
    fVar157 = fVar93 * auVar74._20_4_ * 3.0;
    auVar27._20_4_ = fVar157;
    fVar248 = fVar93 * auVar74._24_4_ * 3.0;
    auVar27._24_4_ = fVar248;
    auVar27._28_4_ = 0x40400000;
    auVar198._0_4_ = fVar93 * auVar12._0_4_ * 3.0;
    auVar198._4_4_ = fVar93 * auVar12._4_4_ * 3.0;
    auVar198._8_4_ = fVar93 * auVar12._8_4_ * 3.0;
    auVar198._12_4_ = fVar93 * auVar12._12_4_ * 3.0;
    auVar198._16_4_ = fVar93 * auVar12._16_4_ * 3.0;
    auVar198._20_4_ = fVar93 * auVar12._20_4_ * 3.0;
    auVar198._24_4_ = fVar93 * auVar12._24_4_ * 3.0;
    auVar198._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar66));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar94));
    auVar74 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar206));
    auVar12 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar79));
    auVar14 = vsubps_avx(auVar17,local_2a8);
    fVar260 = auVar74._0_4_ + auVar14._0_4_;
    fVar178 = auVar74._4_4_ + auVar14._4_4_;
    fVar180 = auVar74._8_4_ + auVar14._8_4_;
    fVar182 = auVar74._12_4_ + auVar14._12_4_;
    fVar183 = auVar74._16_4_ + auVar14._16_4_;
    fVar184 = auVar74._20_4_ + auVar14._20_4_;
    fVar185 = auVar74._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_78,auVar16);
    auVar270._0_4_ = auVar12._0_4_ + auVar15._0_4_;
    auVar270._4_4_ = auVar12._4_4_ + auVar15._4_4_;
    auVar270._8_4_ = auVar12._8_4_ + auVar15._8_4_;
    auVar270._12_4_ = auVar12._12_4_ + auVar15._12_4_;
    auVar270._16_4_ = auVar12._16_4_ + auVar15._16_4_;
    auVar270._20_4_ = auVar12._20_4_ + auVar15._20_4_;
    auVar270._24_4_ = auVar12._24_4_ + auVar15._24_4_;
    auVar270._28_4_ = auVar12._28_4_ + auVar15._28_4_;
    fVar93 = auVar79._0_4_;
    local_158 = fVar93 + (float)local_5d8._0_4_;
    fVar76 = auVar79._4_4_;
    fStack_154 = fVar76 + (float)local_5d8._4_4_;
    fVar138 = auVar79._8_4_;
    fStack_150 = fVar138 + fStack_5d0;
    fVar121 = auVar79._12_4_;
    fStack_14c = fVar121 + fStack_5cc;
    fStack_148 = fStack_5c8 + 0.0;
    fStack_144 = fStack_5c4 + 0.0;
    fStack_140 = fStack_5c0 + 0.0;
    fStack_13c = auVar13._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar206);
    auVar12 = vsubps_avx(local_98,auVar258);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_b8 = ZEXT1632(auVar79);
    auVar12 = vsubps_avx(local_b8,_local_5d8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_f8._0_4_ = auVar66._0_4_ + fVar137;
    local_f8._4_4_ = auVar66._4_4_ + fVar153;
    local_f8._8_4_ = auVar66._8_4_ + fVar154;
    local_f8._12_4_ = auVar66._12_4_ + fVar155;
    local_f8._16_4_ = fVar156 + 0.0;
    local_f8._20_4_ = fVar157 + 0.0;
    local_f8._24_4_ = fVar248 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar258 = ZEXT1632(auVar66);
    auVar12 = vsubps_avx(auVar258,auVar27);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    fVar137 = auVar94._0_4_;
    local_138._0_4_ = fVar137 + auVar198._0_4_;
    fVar153 = auVar94._4_4_;
    local_138._4_4_ = fVar153 + auVar198._4_4_;
    fVar154 = auVar94._8_4_;
    local_138._8_4_ = fVar154 + auVar198._8_4_;
    fVar155 = auVar94._12_4_;
    local_138._12_4_ = fVar155 + auVar198._12_4_;
    local_138._16_4_ = auVar198._16_4_ + 0.0;
    local_138._20_4_ = auVar198._20_4_ + 0.0;
    local_138._24_4_ = auVar198._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar12 = vsubps_avx(ZEXT1632(auVar94),auVar198);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    auVar28._4_4_ = fVar76 * fVar178;
    auVar28._0_4_ = fVar93 * fVar260;
    auVar28._8_4_ = fVar138 * fVar180;
    auVar28._12_4_ = fVar121 * fVar182;
    auVar28._16_4_ = fVar183 * 0.0;
    auVar28._20_4_ = fVar184 * 0.0;
    auVar28._24_4_ = fVar185 * 0.0;
    auVar28._28_4_ = auVar12._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar28,local_98,auVar270);
    auVar29._4_4_ = fStack_154 * fVar178;
    auVar29._0_4_ = local_158 * fVar260;
    auVar29._8_4_ = fStack_150 * fVar180;
    auVar29._12_4_ = fStack_14c * fVar182;
    auVar29._16_4_ = fStack_148 * fVar183;
    auVar29._20_4_ = fStack_144 * fVar184;
    auVar29._24_4_ = fStack_140 * fVar185;
    auVar29._28_4_ = auVar18._28_4_;
    auVar42._4_4_ = fVar261;
    auVar42._0_4_ = fVar259;
    auVar42._8_4_ = fVar234;
    auVar42._12_4_ = fVar235;
    auVar42._16_4_ = fVar236;
    auVar42._20_4_ = fVar237;
    auVar42._24_4_ = fVar238;
    auVar42._28_4_ = 0x40400000;
    auVar72 = vfnmadd231ps_fma(auVar29,auVar270,auVar42);
    auVar30._4_4_ = local_178._4_4_ * fVar178;
    auVar30._0_4_ = local_178._0_4_ * fVar260;
    auVar30._8_4_ = local_178._8_4_ * fVar180;
    auVar30._12_4_ = local_178._12_4_ * fVar182;
    auVar30._16_4_ = local_178._16_4_ * fVar183;
    auVar30._20_4_ = local_178._20_4_ * fVar184;
    auVar30._24_4_ = local_178._24_4_ * fVar185;
    auVar30._28_4_ = fStack_13c;
    auVar276 = vfnmadd231ps_fma(auVar30,local_d8,auVar270);
    local_5f8._0_4_ = auVar16._0_4_;
    local_5f8._4_4_ = auVar16._4_4_;
    uStack_5f0._0_4_ = auVar16._8_4_;
    uStack_5f0._4_4_ = auVar16._12_4_;
    uStack_5e8._0_4_ = auVar16._16_4_;
    uStack_5e8._4_4_ = auVar16._20_4_;
    uStack_5e0._0_4_ = auVar16._24_4_;
    auVar31._4_4_ = fVar178 * (float)local_5f8._4_4_;
    auVar31._0_4_ = fVar260 * (float)local_5f8._0_4_;
    auVar31._8_4_ = fVar180 * (float)uStack_5f0;
    auVar31._12_4_ = fVar182 * uStack_5f0._4_4_;
    auVar31._16_4_ = fVar183 * (float)uStack_5e8;
    auVar31._20_4_ = fVar184 * uStack_5e8._4_4_;
    auVar31._24_4_ = fVar185 * (float)uStack_5e0;
    auVar31._28_4_ = local_178._28_4_;
    auVar67 = vfnmadd231ps_fma(auVar31,local_2a8,auVar270);
    auVar50._4_4_ = fVar153 * fVar178;
    auVar50._0_4_ = fVar137 * fVar260;
    auVar50._8_4_ = fVar154 * fVar180;
    auVar50._12_4_ = fVar155 * fVar182;
    auVar50._16_4_ = fVar183 * 0.0;
    auVar50._20_4_ = fVar184 * 0.0;
    auVar50._24_4_ = fVar185 * 0.0;
    auVar50._28_4_ = DAT_0205d4a0._28_4_;
    auVar66 = vfnmadd231ps_fma(auVar50,auVar258,auVar270);
    auVar32._4_4_ = local_138._4_4_ * fVar178;
    auVar32._0_4_ = local_138._0_4_ * fVar260;
    auVar32._8_4_ = local_138._8_4_ * fVar180;
    auVar32._12_4_ = local_138._12_4_ * fVar182;
    auVar32._16_4_ = local_138._16_4_ * fVar183;
    auVar32._20_4_ = local_138._20_4_ * fVar184;
    auVar32._24_4_ = local_138._24_4_ * fVar185;
    auVar32._28_4_ = local_2a8._28_4_;
    auVar78 = vfnmadd231ps_fma(auVar32,local_f8,auVar270);
    auVar33._4_4_ = local_118._4_4_ * fVar178;
    auVar33._0_4_ = local_118._0_4_ * fVar260;
    auVar33._8_4_ = local_118._8_4_ * fVar180;
    auVar33._12_4_ = local_118._12_4_ * fVar182;
    auVar33._16_4_ = local_118._16_4_ * fVar183;
    auVar33._20_4_ = local_118._20_4_ * fVar184;
    auVar33._24_4_ = local_118._24_4_ * fVar185;
    auVar33._28_4_ = local_d8._28_4_;
    auVar206 = vfnmadd231ps_fma(auVar33,auVar270,auVar18);
    auVar34._4_4_ = local_78._4_4_ * fVar178;
    auVar34._0_4_ = local_78._0_4_ * fVar260;
    auVar34._8_4_ = local_78._8_4_ * fVar180;
    auVar34._12_4_ = local_78._12_4_ * fVar182;
    auVar34._16_4_ = local_78._16_4_ * fVar183;
    auVar34._20_4_ = local_78._20_4_ * fVar184;
    auVar34._24_4_ = local_78._24_4_ * fVar185;
    auVar34._28_4_ = auVar74._28_4_ + auVar14._28_4_;
    auVar79 = vfnmadd231ps_fma(auVar34,auVar270,auVar17);
    auVar12 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar72));
    auVar74 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar72));
    auVar13 = vminps_avx(ZEXT1632(auVar276),ZEXT1632(auVar67));
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar276),ZEXT1632(auVar67));
    auVar74 = vmaxps_avx(auVar74,auVar12);
    auVar14 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar78));
    auVar12 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar78));
    auVar15 = vminps_avx(ZEXT1632(auVar206),ZEXT1632(auVar79));
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar206),ZEXT1632(auVar79));
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar74,auVar12);
    auVar49._4_4_ = fStack_194;
    auVar49._0_4_ = local_198;
    auVar49._8_4_ = fStack_190;
    auVar49._12_4_ = fStack_18c;
    auVar49._16_4_ = fStack_188;
    auVar49._20_4_ = fStack_184;
    auVar49._24_4_ = fStack_180;
    auVar49._28_4_ = fStack_17c;
    auVar74 = vcmpps_avx(auVar14,auVar49,2);
    auVar48._4_4_ = fStack_1b4;
    auVar48._0_4_ = local_1b8;
    auVar48._8_4_ = fStack_1b0;
    auVar48._12_4_ = fStack_1ac;
    auVar48._16_4_ = fStack_1a8;
    auVar48._20_4_ = fStack_1a4;
    auVar48._24_4_ = fStack_1a0;
    auVar48._28_4_ = fStack_19c;
    auVar12 = vcmpps_avx(auVar12,auVar48,5);
    auVar74 = vandps_avx(auVar12,auVar74);
    auVar12 = local_288 & auVar74;
    uVar52 = 0;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar12 = vsubps_avx(local_2a8,local_98);
      auVar13 = vsubps_avx(auVar17,auVar258);
      fVar157 = auVar12._0_4_ + auVar13._0_4_;
      fVar248 = auVar12._4_4_ + auVar13._4_4_;
      fVar260 = auVar12._8_4_ + auVar13._8_4_;
      fVar178 = auVar12._12_4_ + auVar13._12_4_;
      fVar180 = auVar12._16_4_ + auVar13._16_4_;
      fVar182 = auVar12._20_4_ + auVar13._20_4_;
      fVar183 = auVar12._24_4_ + auVar13._24_4_;
      auVar14 = vsubps_avx(auVar16,local_b8);
      auVar15 = vsubps_avx(local_78,ZEXT1632(auVar94));
      auVar92._0_4_ = auVar14._0_4_ + auVar15._0_4_;
      auVar92._4_4_ = auVar14._4_4_ + auVar15._4_4_;
      auVar92._8_4_ = auVar14._8_4_ + auVar15._8_4_;
      auVar92._12_4_ = auVar14._12_4_ + auVar15._12_4_;
      auVar92._16_4_ = auVar14._16_4_ + auVar15._16_4_;
      auVar92._20_4_ = auVar14._20_4_ + auVar15._20_4_;
      auVar92._24_4_ = auVar14._24_4_ + auVar15._24_4_;
      fVar156 = auVar15._28_4_;
      auVar92._28_4_ = auVar14._28_4_ + fVar156;
      auVar280._0_4_ = fVar93 * fVar157;
      auVar280._4_4_ = fVar76 * fVar248;
      auVar280._8_4_ = fVar138 * fVar260;
      auVar280._12_4_ = fVar121 * fVar178;
      auVar280._16_4_ = fVar180 * 0.0;
      auVar280._20_4_ = fVar182 * 0.0;
      auVar280._24_4_ = fVar183 * 0.0;
      auVar280._28_4_ = 0;
      auVar66 = vfnmadd231ps_fma(auVar280,auVar92,local_98);
      auVar35._4_4_ = fVar248 * fStack_154;
      auVar35._0_4_ = fVar157 * local_158;
      auVar35._8_4_ = fVar260 * fStack_150;
      auVar35._12_4_ = fVar178 * fStack_14c;
      auVar35._16_4_ = fVar180 * fStack_148;
      auVar35._20_4_ = fVar182 * fStack_144;
      auVar35._24_4_ = fVar183 * fStack_140;
      auVar35._28_4_ = fVar156;
      auVar43._4_4_ = fVar261;
      auVar43._0_4_ = fVar259;
      auVar43._8_4_ = fVar234;
      auVar43._12_4_ = fVar235;
      auVar43._16_4_ = fVar236;
      auVar43._20_4_ = fVar237;
      auVar43._24_4_ = fVar238;
      auVar43._28_4_ = 0x40400000;
      auVar8 = vfnmadd213ps_fma(auVar43,auVar92,auVar35);
      auVar36._4_4_ = fVar248 * local_178._4_4_;
      auVar36._0_4_ = fVar157 * local_178._0_4_;
      auVar36._8_4_ = fVar260 * local_178._8_4_;
      auVar36._12_4_ = fVar178 * local_178._12_4_;
      auVar36._16_4_ = fVar180 * local_178._16_4_;
      auVar36._20_4_ = fVar182 * local_178._20_4_;
      auVar36._24_4_ = fVar183 * local_178._24_4_;
      auVar36._28_4_ = fVar156;
      auVar72 = vfnmadd213ps_fma(local_d8,auVar92,auVar36);
      auVar37._4_4_ = (float)local_5f8._4_4_ * fVar248;
      auVar37._0_4_ = (float)local_5f8._0_4_ * fVar157;
      auVar37._8_4_ = (float)uStack_5f0 * fVar260;
      auVar37._12_4_ = uStack_5f0._4_4_ * fVar178;
      auVar37._16_4_ = (float)uStack_5e8 * fVar180;
      auVar37._20_4_ = uStack_5e8._4_4_ * fVar182;
      auVar37._24_4_ = (float)uStack_5e0 * fVar183;
      auVar37._28_4_ = fVar156;
      auVar94 = vfnmadd231ps_fma(auVar37,auVar92,local_2a8);
      auVar107._0_4_ = fVar137 * fVar157;
      auVar107._4_4_ = fVar153 * fVar248;
      auVar107._8_4_ = fVar154 * fVar260;
      auVar107._12_4_ = fVar155 * fVar178;
      auVar107._16_4_ = fVar180 * 0.0;
      auVar107._20_4_ = fVar182 * 0.0;
      auVar107._24_4_ = fVar183 * 0.0;
      auVar107._28_4_ = 0;
      auVar78 = vfnmadd231ps_fma(auVar107,auVar92,auVar258);
      auVar38._4_4_ = fVar248 * local_138._4_4_;
      auVar38._0_4_ = fVar157 * local_138._0_4_;
      auVar38._8_4_ = fVar260 * local_138._8_4_;
      auVar38._12_4_ = fVar178 * local_138._12_4_;
      auVar38._16_4_ = fVar180 * local_138._16_4_;
      auVar38._20_4_ = fVar182 * local_138._20_4_;
      auVar38._24_4_ = fVar183 * local_138._24_4_;
      auVar38._28_4_ = auVar16._28_4_;
      auVar276 = vfnmadd213ps_fma(local_f8,auVar92,auVar38);
      auVar39._4_4_ = fVar248 * local_118._4_4_;
      auVar39._0_4_ = fVar157 * local_118._0_4_;
      auVar39._8_4_ = fVar260 * local_118._8_4_;
      auVar39._12_4_ = fVar178 * local_118._12_4_;
      auVar39._16_4_ = fVar180 * local_118._16_4_;
      auVar39._20_4_ = fVar182 * local_118._20_4_;
      auVar39._24_4_ = fVar183 * local_118._24_4_;
      auVar39._28_4_ = auVar16._28_4_;
      auVar67 = vfnmadd213ps_fma(auVar18,auVar92,auVar39);
      auVar40._4_4_ = local_78._4_4_ * fVar248;
      auVar40._0_4_ = local_78._0_4_ * fVar157;
      auVar40._8_4_ = local_78._8_4_ * fVar260;
      auVar40._12_4_ = local_78._12_4_ * fVar178;
      auVar40._16_4_ = local_78._16_4_ * fVar180;
      auVar40._20_4_ = local_78._20_4_ * fVar182;
      auVar40._24_4_ = local_78._24_4_ * fVar183;
      auVar40._28_4_ = auVar12._28_4_ + auVar13._28_4_;
      auVar206 = vfnmadd231ps_fma(auVar40,auVar92,auVar17);
      auVar13 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar8));
      auVar12 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar8));
      auVar14 = vminps_avx(ZEXT1632(auVar72),ZEXT1632(auVar94));
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar72),ZEXT1632(auVar94));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar15 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar276));
      auVar13 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar276));
      auVar16 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar206));
      auVar15 = vminps_avx(auVar15,auVar16);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar206));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vcmpps_avx(auVar15,auVar49,2);
      auVar13 = vcmpps_avx(auVar13,auVar48,5);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar74 = vandps_avx(auVar74,local_288);
      auVar13 = auVar74 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar74 = vandps_avx(auVar12,auVar74);
        uVar52 = vmovmskps_avx(auVar74);
      }
    }
    if (uVar52 != 0) {
      auStack_408[uVar55] = uVar52;
      uVar159 = vmovlps_avx(local_358);
      *(undefined8 *)(&uStack_268 + uVar55 * 2) = uVar159;
      uVar60 = vmovlps_avx(auVar139);
      auStack_58[uVar55] = uVar60;
      uVar55 = (ulong)((int)uVar55 + 1);
    }
    do {
      if ((int)uVar55 == 0) {
        if (bVar61) {
          return local_669;
        }
        uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar73._4_4_ = uVar65;
        auVar73._0_4_ = uVar65;
        auVar73._8_4_ = uVar65;
        auVar73._12_4_ = uVar65;
        auVar8 = vcmpps_avx(local_368,auVar73,2);
        uVar51 = vmovmskps_avx(auVar8);
        uVar51 = (uint)uVar62 & uVar51;
        local_669 = uVar51 != 0;
        if (!local_669) {
          return local_669;
        }
        goto LAB_01681c8c;
      }
      uVar53 = (int)uVar55 - 1;
      uVar56 = (ulong)uVar53;
      uVar59 = auStack_408[uVar56];
      uVar52 = (&uStack_268)[uVar56 * 2];
      fVar137 = afStack_264[uVar56 * 2];
      iVar54 = 0;
      for (uVar60 = (ulong)uVar59; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        iVar54 = iVar54 + 1;
      }
      uVar59 = uVar59 - 1 & uVar59;
      if (uVar59 == 0) {
        uVar55 = (ulong)uVar53;
      }
      auVar282._8_8_ = 0;
      auVar282._0_8_ = auStack_58[uVar56];
      auVar287 = ZEXT1664(auVar282);
      auStack_408[uVar56] = uVar59;
      fVar153 = (float)(iVar54 + 1) * 0.14285715;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * (float)iVar54 * 0.14285715)),ZEXT416(uVar52)
                               ,ZEXT416((uint)(1.0 - (float)iVar54 * 0.14285715)));
      auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar153)),ZEXT416(uVar52),
                                ZEXT416((uint)(1.0 - fVar153)));
      fVar153 = auVar72._0_4_;
      fVar154 = auVar8._0_4_;
      fVar137 = fVar153 - fVar154;
      if (0.16666667 <= fVar137) break;
      auVar276 = vshufps_avx(auVar282,auVar282,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = &DAT_3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar67 = vsubps_avx(auVar97,auVar276);
      fVar155 = auVar276._0_4_;
      auVar112._0_4_ = fVar155 * (float)local_448._0_4_;
      fVar93 = auVar276._4_4_;
      auVar112._4_4_ = fVar93 * (float)local_448._4_4_;
      fVar76 = auVar276._8_4_;
      auVar112._8_4_ = fVar76 * fStack_440;
      fVar138 = auVar276._12_4_;
      auVar112._12_4_ = fVar138 * fStack_43c;
      auVar125._0_4_ = fVar155 * (float)local_458._0_4_;
      auVar125._4_4_ = fVar93 * (float)local_458._4_4_;
      auVar125._8_4_ = fVar76 * fStack_450;
      auVar125._12_4_ = fVar138 * fStack_44c;
      auVar146._0_4_ = fVar155 * (float)local_468._0_4_;
      auVar146._4_4_ = fVar93 * (float)local_468._4_4_;
      auVar146._8_4_ = fVar76 * fStack_460;
      auVar146._12_4_ = fVar138 * fStack_45c;
      auVar84._0_4_ = fVar155 * (float)local_478._0_4_;
      auVar84._4_4_ = fVar93 * (float)local_478._4_4_;
      auVar84._8_4_ = fVar76 * fStack_470;
      auVar84._12_4_ = fVar138 * fStack_46c;
      auVar276 = vfmadd231ps_fma(auVar112,auVar67,auVar262);
      auVar66 = vfmadd231ps_fma(auVar125,auVar67,local_418);
      auVar94 = vfmadd231ps_fma(auVar146,auVar67,local_428);
      auVar67 = vfmadd231ps_fma(auVar84,auVar67,local_438);
      auVar108._16_16_ = auVar276;
      auVar108._0_16_ = auVar276;
      auVar119._16_16_ = auVar66;
      auVar119._0_16_ = auVar66;
      auVar136._16_16_ = auVar94;
      auVar136._0_16_ = auVar94;
      auVar176._4_4_ = fVar154;
      auVar176._0_4_ = fVar154;
      auVar176._8_4_ = fVar154;
      auVar176._12_4_ = fVar154;
      auVar176._20_4_ = fVar153;
      auVar176._16_4_ = fVar153;
      auVar176._24_4_ = fVar153;
      auVar176._28_4_ = fVar153;
      auVar74 = vsubps_avx(auVar119,auVar108);
      auVar66 = vfmadd213ps_fma(auVar74,auVar176,auVar108);
      auVar74 = vsubps_avx(auVar136,auVar119);
      auVar78 = vfmadd213ps_fma(auVar74,auVar176,auVar119);
      auVar276 = vsubps_avx(auVar67,auVar94);
      auVar120._16_16_ = auVar276;
      auVar120._0_16_ = auVar276;
      auVar276 = vfmadd213ps_fma(auVar120,auVar176,auVar136);
      auVar74 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar66));
      auVar67 = vfmadd213ps_fma(auVar74,auVar176,ZEXT1632(auVar66));
      auVar74 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar78));
      auVar276 = vfmadd213ps_fma(auVar74,auVar176,ZEXT1632(auVar78));
      auVar74 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar67));
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar74,auVar176);
      fVar156 = auVar74._4_4_ * 3.0;
      fVar121 = fVar137 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar109._4_4_ + fVar121 * fVar156,
                    auVar109._0_4_ + fVar121 * auVar74._0_4_ * 3.0);
      local_2a8._8_4_ = auVar109._8_4_ + fVar121 * auVar74._8_4_ * 3.0;
      local_2a8._12_4_ = auVar109._12_4_ + fVar121 * auVar74._12_4_ * 3.0;
      auVar67 = vshufpd_avx(auVar109,auVar109,3);
      auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar276 = vsubps_avx(auVar67,auVar109);
      auVar94 = vsubps_avx(auVar66,(undefined1  [16])0x0);
      auVar98._0_4_ = auVar276._0_4_ + auVar94._0_4_;
      auVar98._4_4_ = auVar276._4_4_ + auVar94._4_4_;
      auVar98._8_4_ = auVar276._8_4_ + auVar94._8_4_;
      auVar98._12_4_ = auVar276._12_4_ + auVar94._12_4_;
      auVar276 = vshufps_avx(auVar109,auVar109,0xb1);
      auVar94 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar263._4_4_ = auVar98._0_4_;
      auVar263._0_4_ = auVar98._0_4_;
      auVar263._8_4_ = auVar98._0_4_;
      auVar263._12_4_ = auVar98._0_4_;
      auVar78 = vshufps_avx(auVar98,auVar98,0x55);
      fVar155 = auVar78._0_4_;
      auVar191._0_4_ = auVar276._0_4_ * fVar155;
      fVar93 = auVar78._4_4_;
      auVar191._4_4_ = auVar276._4_4_ * fVar93;
      fVar76 = auVar78._8_4_;
      auVar191._8_4_ = auVar276._8_4_ * fVar76;
      fVar138 = auVar78._12_4_;
      auVar191._12_4_ = auVar276._12_4_ * fVar138;
      auVar204._0_4_ = auVar94._0_4_ * fVar155;
      auVar204._4_4_ = auVar94._4_4_ * fVar93;
      auVar204._8_4_ = auVar94._8_4_ * fVar76;
      auVar204._12_4_ = auVar94._12_4_ * fVar138;
      auVar206 = vfmadd231ps_fma(auVar191,auVar263,auVar109);
      auVar79 = vfmadd231ps_fma(auVar204,auVar263,local_2a8._0_16_);
      auVar94 = vshufps_avx(auVar206,auVar206,0xe8);
      auVar78 = vshufps_avx(auVar79,auVar79,0xe8);
      auVar276 = vcmpps_avx(auVar94,auVar78,1);
      uVar52 = vextractps_avx(auVar276,0);
      auVar123 = auVar79;
      if ((uVar52 & 1) == 0) {
        auVar123 = auVar206;
      }
      auVar126._0_4_ = fVar121 * auVar74._16_4_ * 3.0;
      auVar126._4_4_ = fVar121 * fVar156;
      auVar126._8_4_ = fVar121 * auVar74._24_4_ * 3.0;
      auVar126._12_4_ = fVar121 * fVar153;
      auVar139 = vsubps_avx((undefined1  [16])0x0,auVar126);
      auVar127 = vshufps_avx(auVar139,auVar139,0xb1);
      auVar77 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar283._0_4_ = auVar127._0_4_ * fVar155;
      auVar283._4_4_ = auVar127._4_4_ * fVar93;
      auVar283._8_4_ = auVar127._8_4_ * fVar76;
      auVar283._12_4_ = auVar127._12_4_ * fVar138;
      auVar99._0_4_ = auVar77._0_4_ * fVar155;
      auVar99._4_4_ = auVar77._4_4_ * fVar93;
      auVar99._8_4_ = auVar77._8_4_ * fVar76;
      auVar99._12_4_ = auVar77._12_4_ * fVar138;
      auVar140 = vfmadd231ps_fma(auVar283,auVar263,auVar139);
      auVar141 = vfmadd231ps_fma(auVar99,(undefined1  [16])0x0,auVar263);
      auVar77 = vshufps_avx(auVar140,auVar140,0xe8);
      auVar122 = vshufps_avx(auVar141,auVar141,0xe8);
      auVar127 = vcmpps_avx(auVar77,auVar122,1);
      uVar52 = vextractps_avx(auVar127,0);
      auVar187 = auVar141;
      if ((uVar52 & 1) == 0) {
        auVar187 = auVar140;
      }
      auVar123 = vmaxss_avx(auVar187,auVar123);
      auVar94 = vminps_avx(auVar94,auVar78);
      auVar78 = vminps_avx(auVar77,auVar122);
      auVar78 = vminps_avx(auVar94,auVar78);
      auVar276 = vshufps_avx(auVar276,auVar276,0x55);
      auVar276 = vblendps_avx(auVar276,auVar127,2);
      auVar127 = vpslld_avx(auVar276,0x1f);
      auVar276 = vshufpd_avx(auVar79,auVar79,1);
      auVar276 = vinsertps_avx(auVar276,auVar141,0x9c);
      auVar94 = vshufpd_avx(auVar206,auVar206,1);
      auVar94 = vinsertps_avx(auVar94,auVar140,0x9c);
      auVar276 = vblendvps_avx(auVar94,auVar276,auVar127);
      auVar94 = vmovshdup_avx(auVar276);
      auVar276 = vmaxss_avx(auVar94,auVar276);
      fVar76 = auVar78._0_4_;
      auVar94 = vmovshdup_avx(auVar78);
      fVar93 = auVar276._0_4_;
      fVar155 = auVar123._0_4_;
      if ((0.0001 <= fVar76) || (fVar93 <= -0.0001)) {
        auVar206 = vcmpps_avx(auVar94,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar79 = vcmpps_avx(auVar78,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar206 = vorps_avx(auVar79,auVar206);
        if ((-0.0001 < fVar155 & auVar206[0]) != 0) goto LAB_01682d5f;
        auVar206 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar276,5);
        auVar79 = vcmpps_avx(auVar94,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar206 = vorps_avx(auVar79,auVar206);
        if ((auVar206 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01682d5f;
        bVar41 = true;
      }
      else {
LAB_01682d5f:
        auVar79 = vcmpps_avx(auVar78,_DAT_01feba10,1);
        auVar127 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar206 = vcmpss_avx(auVar123,ZEXT816(0) << 0x20,1);
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = &DAT_3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar205._8_4_ = 0xbf800000;
        auVar205._0_8_ = 0xbf800000bf800000;
        auVar205._12_4_ = 0xbf800000;
        auVar206 = vblendvps_avx(auVar147,auVar205,auVar206);
        auVar79 = vblendvps_avx(auVar147,auVar205,auVar79);
        fVar138 = auVar79._0_4_;
        fVar121 = auVar206._0_4_;
        auVar206 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar77 = ZEXT816(0) << 0x20;
        if ((fVar138 == fVar121) && (!NAN(fVar138) && !NAN(fVar121))) {
          auVar206 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar138 == fVar121) && (!NAN(fVar138) && !NAN(fVar121))) {
          auVar127 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar79 = vmovshdup_avx(auVar79);
        fVar156 = auVar79._0_4_;
        if ((fVar138 != fVar156) || (NAN(fVar138) || NAN(fVar156))) {
          fVar138 = auVar94._0_4_;
          if ((fVar138 != fVar76) || (NAN(fVar138) || NAN(fVar76))) {
            auVar100._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar100._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar100._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar128._0_4_ = -fVar76 / (fVar138 - fVar76);
            auVar128._4_12_ = auVar100._4_12_;
            auVar94 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar77,auVar128);
            auVar78 = auVar94;
          }
          else {
            auVar94 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar76 == 0.0) && (auVar94 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar76))) {
              auVar94 = ZEXT816(0);
            }
            auVar78 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar76 == 0.0) && (auVar78 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar76))) {
              auVar78 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar206 = vminss_avx(auVar206,auVar94);
          auVar127 = vmaxss_avx(auVar78,auVar127);
        }
        auVar276 = vcmpss_avx(auVar276,auVar77,1);
        auVar129._8_4_ = 0x3f800000;
        auVar129._0_8_ = &DAT_3f8000003f800000;
        auVar129._12_4_ = 0x3f800000;
        auVar148._8_4_ = 0xbf800000;
        auVar148._0_8_ = 0xbf800000bf800000;
        auVar148._12_4_ = 0xbf800000;
        auVar276 = vblendvps_avx(auVar129,auVar148,auVar276);
        fVar76 = auVar276._0_4_;
        auVar276 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar121 != fVar76) || (NAN(fVar121) || NAN(fVar76))) {
          if ((fVar93 != fVar155) || (NAN(fVar93) || NAN(fVar155))) {
            auVar101._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = auVar123._8_4_ ^ 0x80000000;
            auVar101._12_4_ = auVar123._12_4_ ^ 0x80000000;
            auVar130._0_4_ = -fVar155 / (fVar93 - fVar155);
            auVar130._4_12_ = auVar101._4_12_;
            auVar94 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar77,auVar130);
            auVar78 = auVar94;
          }
          else {
            auVar94 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar155 == 0.0) && (auVar94 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar155))) {
              auVar94 = ZEXT816(0);
            }
            auVar78 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar155 == 0.0) && (auVar78 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar155))) {
              auVar78 = auVar276;
            }
          }
          auVar206 = vminss_avx(auVar206,auVar94);
          auVar127 = vmaxss_avx(auVar78,auVar127);
        }
        if ((fVar156 != fVar76) || (NAN(fVar156) || NAN(fVar76))) {
          auVar206 = vminss_avx(auVar206,auVar276);
          auVar127 = vmaxss_avx(auVar276,auVar127);
        }
        auVar94 = vmaxss_avx(auVar77,auVar206);
        auVar78 = vminss_avx(auVar127,auVar276);
        bVar41 = true;
        if (auVar94._0_4_ <= auVar78._0_4_) {
          auVar94 = vmaxss_avx(auVar77,ZEXT416((uint)(auVar94._0_4_ + -0.1)));
          auVar276 = vminss_avx(ZEXT416((uint)(auVar78._0_4_ + 0.1)),auVar276);
          auVar85._0_8_ = auVar109._0_8_;
          auVar85._8_8_ = auVar85._0_8_;
          auVar207._8_8_ = local_2a8._0_8_;
          auVar207._0_8_ = local_2a8._0_8_;
          auVar222._8_8_ = auVar139._0_8_;
          auVar222._0_8_ = auVar139._0_8_;
          auVar78 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
          auVar206 = vshufpd_avx(auVar139,auVar139,3);
          auVar79 = vshufps_avx(auVar94,auVar276,0);
          auVar113._8_4_ = 0x3f800000;
          auVar113._0_8_ = &DAT_3f8000003f800000;
          auVar113._12_4_ = 0x3f800000;
          auVar109 = vsubps_avx(auVar113,auVar79);
          local_5d8._0_4_ = auVar67._0_4_;
          local_5d8._4_4_ = auVar67._4_4_;
          fStack_5d0 = auVar67._8_4_;
          fStack_5cc = auVar67._12_4_;
          fVar155 = auVar79._0_4_;
          auVar114._0_4_ = fVar155 * (float)local_5d8._0_4_;
          fVar93 = auVar79._4_4_;
          auVar114._4_4_ = fVar93 * (float)local_5d8._4_4_;
          fVar76 = auVar79._8_4_;
          auVar114._8_4_ = fVar76 * fStack_5d0;
          fVar138 = auVar79._12_4_;
          auVar114._12_4_ = fVar138 * fStack_5cc;
          auVar131._0_4_ = auVar78._0_4_ * fVar155;
          auVar131._4_4_ = auVar78._4_4_ * fVar93;
          auVar131._8_4_ = auVar78._8_4_ * fVar76;
          auVar131._12_4_ = auVar78._12_4_ * fVar138;
          auVar149._0_4_ = auVar206._0_4_ * fVar155;
          auVar149._4_4_ = auVar206._4_4_ * fVar93;
          auVar149._8_4_ = auVar206._8_4_ * fVar76;
          auVar149._12_4_ = auVar206._12_4_ * fVar138;
          local_5f8._0_4_ = auVar66._0_4_;
          local_5f8._4_4_ = auVar66._4_4_;
          uStack_5f0._0_4_ = auVar66._8_4_;
          uStack_5f0._4_4_ = auVar66._12_4_;
          auVar171._0_4_ = fVar155 * (float)local_5f8._0_4_;
          auVar171._4_4_ = fVar93 * (float)local_5f8._4_4_;
          auVar171._8_4_ = fVar76 * (float)uStack_5f0;
          auVar171._12_4_ = fVar138 * uStack_5f0._4_4_;
          auVar78 = vfmadd231ps_fma(auVar114,auVar109,auVar85);
          auVar206 = vfmadd231ps_fma(auVar131,auVar109,auVar207);
          auVar79 = vfmadd231ps_fma(auVar149,auVar109,auVar222);
          auVar109 = vfmadd231ps_fma(auVar171,auVar109,ZEXT816(0));
          auVar67 = vmovshdup_avx(auVar282);
          auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar94._0_4_)),auVar282,
                                    ZEXT416((uint)(1.0 - auVar94._0_4_)));
          auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar276._0_4_)),auVar282,
                                     ZEXT416((uint)(1.0 - auVar276._0_4_)));
          fVar155 = 1.0 / fVar137;
          auVar276 = vsubps_avx(auVar206,auVar78);
          auVar192._0_4_ = auVar276._0_4_ * 3.0;
          auVar192._4_4_ = auVar276._4_4_ * 3.0;
          auVar192._8_4_ = auVar276._8_4_ * 3.0;
          auVar192._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar79,auVar206);
          auVar208._0_4_ = auVar276._0_4_ * 3.0;
          auVar208._4_4_ = auVar276._4_4_ * 3.0;
          auVar208._8_4_ = auVar276._8_4_ * 3.0;
          auVar208._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar109,auVar79);
          auVar223._0_4_ = auVar276._0_4_ * 3.0;
          auVar223._4_4_ = auVar276._4_4_ * 3.0;
          auVar223._8_4_ = auVar276._8_4_ * 3.0;
          auVar223._12_4_ = auVar276._12_4_ * 3.0;
          auVar67 = vminps_avx(auVar208,auVar223);
          auVar276 = vmaxps_avx(auVar208,auVar223);
          auVar67 = vminps_avx(auVar192,auVar67);
          auVar276 = vmaxps_avx(auVar192,auVar276);
          auVar66 = vshufpd_avx(auVar67,auVar67,3);
          auVar94 = vshufpd_avx(auVar276,auVar276,3);
          auVar67 = vminps_avx(auVar67,auVar66);
          auVar276 = vmaxps_avx(auVar276,auVar94);
          auVar209._0_4_ = auVar67._0_4_ * fVar155;
          auVar209._4_4_ = auVar67._4_4_ * fVar155;
          auVar209._8_4_ = auVar67._8_4_ * fVar155;
          auVar209._12_4_ = auVar67._12_4_ * fVar155;
          auVar193._0_4_ = fVar155 * auVar276._0_4_;
          auVar193._4_4_ = fVar155 * auVar276._4_4_;
          auVar193._8_4_ = fVar155 * auVar276._8_4_;
          auVar193._12_4_ = fVar155 * auVar276._12_4_;
          fVar155 = 1.0 / (auVar122._0_4_ - auVar77._0_4_);
          auVar276 = vshufpd_avx(auVar78,auVar78,3);
          auVar67 = vshufpd_avx(auVar206,auVar206,3);
          auVar66 = vshufpd_avx(auVar79,auVar79,3);
          auVar94 = vshufpd_avx(auVar109,auVar109,3);
          auVar276 = vsubps_avx(auVar276,auVar78);
          auVar78 = vsubps_avx(auVar67,auVar206);
          auVar206 = vsubps_avx(auVar66,auVar79);
          auVar94 = vsubps_avx(auVar94,auVar109);
          auVar67 = vminps_avx(auVar276,auVar78);
          auVar276 = vmaxps_avx(auVar276,auVar78);
          auVar66 = vminps_avx(auVar206,auVar94);
          auVar66 = vminps_avx(auVar67,auVar66);
          auVar67 = vmaxps_avx(auVar206,auVar94);
          auVar276 = vmaxps_avx(auVar276,auVar67);
          auVar241._0_4_ = fVar155 * auVar66._0_4_;
          auVar241._4_4_ = fVar155 * auVar66._4_4_;
          auVar241._8_4_ = fVar155 * auVar66._8_4_;
          auVar241._12_4_ = fVar155 * auVar66._12_4_;
          auVar229._0_4_ = fVar155 * auVar276._0_4_;
          auVar229._4_4_ = fVar155 * auVar276._4_4_;
          auVar229._8_4_ = fVar155 * auVar276._8_4_;
          auVar229._12_4_ = fVar155 * auVar276._12_4_;
          auVar94 = vinsertps_avx(auVar8,auVar77,0x10);
          auVar78 = vinsertps_avx(auVar72,auVar122,0x10);
          auVar71._0_4_ = (auVar94._0_4_ + auVar78._0_4_) * 0.5;
          auVar71._4_4_ = (auVar94._4_4_ + auVar78._4_4_) * 0.5;
          auVar71._8_4_ = (auVar94._8_4_ + auVar78._8_4_) * 0.5;
          auVar71._12_4_ = (auVar94._12_4_ + auVar78._12_4_) * 0.5;
          auVar115._4_4_ = auVar71._0_4_;
          auVar115._0_4_ = auVar71._0_4_;
          auVar115._8_4_ = auVar71._0_4_;
          auVar115._12_4_ = auVar71._0_4_;
          auVar276 = vfmadd213ps_fma(local_2b8,auVar115,auVar9);
          auVar67 = vfmadd213ps_fma(local_2c8,auVar115,auVar10);
          auVar66 = vfmadd213ps_fma(local_2d8,auVar115,auVar11);
          auVar72 = vsubps_avx(auVar67,auVar276);
          auVar276 = vfmadd213ps_fma(auVar72,auVar115,auVar276);
          auVar72 = vsubps_avx(auVar66,auVar67);
          auVar72 = vfmadd213ps_fma(auVar72,auVar115,auVar67);
          auVar72 = vsubps_avx(auVar72,auVar276);
          auVar276 = vfmadd231ps_fma(auVar276,auVar72,auVar115);
          auVar116._0_8_ = CONCAT44(auVar72._4_4_ * 3.0,auVar72._0_4_ * 3.0);
          auVar116._8_4_ = auVar72._8_4_ * 3.0;
          auVar116._12_4_ = auVar72._12_4_ * 3.0;
          auVar224._8_8_ = auVar276._0_8_;
          auVar224._0_8_ = auVar276._0_8_;
          auVar72 = vshufpd_avx(auVar276,auVar276,3);
          auVar276 = vshufps_avx(auVar71,auVar71,0x55);
          auVar206 = vsubps_avx(auVar72,auVar224);
          auVar109 = vfmadd231ps_fma(auVar224,auVar276,auVar206);
          auVar264._8_8_ = auVar116._0_8_;
          auVar264._0_8_ = auVar116._0_8_;
          auVar72 = vshufpd_avx(auVar116,auVar116,3);
          auVar72 = vsubps_avx(auVar72,auVar264);
          auVar79 = vfmadd213ps_fma(auVar72,auVar276,auVar264);
          auVar276 = vmovshdup_avx(auVar79);
          auVar265._0_8_ = auVar276._0_8_ ^ 0x8000000080000000;
          auVar265._8_4_ = auVar276._8_4_ ^ 0x80000000;
          auVar265._12_4_ = auVar276._12_4_ ^ 0x80000000;
          auVar67 = vmovshdup_avx(auVar206);
          auVar72 = vunpcklps_avx(auVar67,auVar265);
          auVar66 = vshufps_avx(auVar72,auVar265,4);
          auVar284._0_8_ = auVar206._0_8_ ^ 0x8000000080000000;
          auVar284._8_4_ = auVar206._8_4_ ^ 0x80000000;
          auVar284._12_4_ = auVar206._12_4_ ^ 0x80000000;
          auVar72 = vmovlhps_avx(auVar284,auVar79);
          auVar72 = vshufps_avx(auVar72,auVar79,8);
          auVar276 = vfmsub231ss_fma(ZEXT416((uint)(auVar276._0_4_ * auVar206._0_4_)),auVar67,
                                     auVar79);
          auVar132._0_4_ = auVar276._0_4_;
          auVar132._4_4_ = auVar132._0_4_;
          auVar132._8_4_ = auVar132._0_4_;
          auVar132._12_4_ = auVar132._0_4_;
          auVar276 = vdivps_avx(auVar66,auVar132);
          auVar67 = vdivps_avx(auVar72,auVar132);
          fVar76 = auVar109._0_4_;
          fVar155 = auVar276._0_4_;
          auVar72 = vshufps_avx(auVar109,auVar109,0x55);
          fVar93 = auVar67._0_4_;
          local_5f8._4_4_ = fVar76 * auVar276._4_4_ + auVar72._4_4_ * auVar67._4_4_;
          local_5f8._0_4_ = fVar76 * fVar155 + auVar72._0_4_ * fVar93;
          uStack_5f0._0_4_ = fVar76 * auVar276._8_4_ + auVar72._8_4_ * auVar67._8_4_;
          uStack_5f0._4_4_ = fVar76 * auVar276._12_4_ + auVar72._12_4_ * auVar67._12_4_;
          auVar206 = vmovshdup_avx(auVar276);
          auVar72 = vinsertps_avx(auVar209,auVar241,0x1c);
          auVar277._0_4_ = auVar206._0_4_ * auVar72._0_4_;
          auVar277._4_4_ = auVar206._4_4_ * auVar72._4_4_;
          auVar277._8_4_ = auVar206._8_4_ * auVar72._8_4_;
          auVar277._12_4_ = auVar206._12_4_ * auVar72._12_4_;
          auVar66 = vinsertps_avx(auVar193,auVar229,0x1c);
          auVar251._0_4_ = auVar206._0_4_ * auVar66._0_4_;
          auVar251._4_4_ = auVar206._4_4_ * auVar66._4_4_;
          auVar251._8_4_ = auVar206._8_4_ * auVar66._8_4_;
          auVar251._12_4_ = auVar206._12_4_ * auVar66._12_4_;
          auVar123 = vminps_avx(auVar277,auVar251);
          auVar109 = vmaxps_avx(auVar251,auVar277);
          auVar206 = vinsertps_avx(auVar241,auVar209,0x4c);
          auVar127 = vmovshdup_avx(auVar67);
          auVar79 = vinsertps_avx(auVar229,auVar193,0x4c);
          auVar230._0_4_ = auVar127._0_4_ * auVar206._0_4_;
          auVar230._4_4_ = auVar127._4_4_ * auVar206._4_4_;
          auVar230._8_4_ = auVar127._8_4_ * auVar206._8_4_;
          auVar230._12_4_ = auVar127._12_4_ * auVar206._12_4_;
          auVar242._0_4_ = auVar127._0_4_ * auVar79._0_4_;
          auVar242._4_4_ = auVar127._4_4_ * auVar79._4_4_;
          auVar242._8_4_ = auVar127._8_4_ * auVar79._8_4_;
          auVar242._12_4_ = auVar127._12_4_ * auVar79._12_4_;
          auVar127 = vminps_avx(auVar230,auVar242);
          auVar86._0_4_ = auVar127._0_4_ + auVar123._0_4_;
          auVar86._4_4_ = auVar127._4_4_ + auVar123._4_4_;
          auVar86._8_4_ = auVar127._8_4_ + auVar123._8_4_;
          auVar86._12_4_ = auVar127._12_4_ + auVar123._12_4_;
          auVar123 = vmaxps_avx(auVar242,auVar230);
          auVar231._0_4_ = auVar109._0_4_ + auVar123._0_4_;
          auVar231._4_4_ = auVar109._4_4_ + auVar123._4_4_;
          auVar231._8_4_ = auVar109._8_4_ + auVar123._8_4_;
          auVar231._12_4_ = auVar109._12_4_ + auVar123._12_4_;
          auVar243._8_8_ = 0x3f80000000000000;
          auVar243._0_8_ = 0x3f80000000000000;
          auVar109 = vsubps_avx(auVar243,auVar231);
          auVar123 = vsubps_avx(auVar243,auVar86);
          auVar127 = vsubps_avx(auVar94,auVar71);
          auVar266._0_4_ = fVar155 * auVar72._0_4_;
          auVar266._4_4_ = fVar155 * auVar72._4_4_;
          auVar266._8_4_ = fVar155 * auVar72._8_4_;
          auVar266._12_4_ = fVar155 * auVar72._12_4_;
          auVar252._0_4_ = fVar155 * auVar66._0_4_;
          auVar252._4_4_ = fVar155 * auVar66._4_4_;
          auVar252._8_4_ = fVar155 * auVar66._8_4_;
          auVar252._12_4_ = fVar155 * auVar66._12_4_;
          auVar66 = vminps_avx(auVar266,auVar252);
          auVar72 = vmaxps_avx(auVar252,auVar266);
          auVar210._0_4_ = fVar93 * auVar206._0_4_;
          auVar210._4_4_ = fVar93 * auVar206._4_4_;
          auVar210._8_4_ = fVar93 * auVar206._8_4_;
          auVar210._12_4_ = fVar93 * auVar206._12_4_;
          auVar194._0_4_ = fVar93 * auVar79._0_4_;
          auVar194._4_4_ = fVar93 * auVar79._4_4_;
          auVar194._8_4_ = fVar93 * auVar79._8_4_;
          auVar194._12_4_ = fVar93 * auVar79._12_4_;
          auVar206 = vminps_avx(auVar210,auVar194);
          auVar267._0_4_ = auVar66._0_4_ + auVar206._0_4_;
          auVar267._4_4_ = auVar66._4_4_ + auVar206._4_4_;
          auVar267._8_4_ = auVar66._8_4_ + auVar206._8_4_;
          auVar267._12_4_ = auVar66._12_4_ + auVar206._12_4_;
          auVar206 = vsubps_avx(auVar78,auVar71);
          auVar66 = vmaxps_avx(auVar194,auVar210);
          fVar76 = auVar127._0_4_;
          auVar211._0_4_ = fVar76 * auVar109._0_4_;
          fVar138 = auVar127._4_4_;
          auVar211._4_4_ = fVar138 * auVar109._4_4_;
          fVar121 = auVar127._8_4_;
          auVar211._8_4_ = fVar121 * auVar109._8_4_;
          fVar156 = auVar127._12_4_;
          auVar211._12_4_ = fVar156 * auVar109._12_4_;
          auVar195._0_4_ = auVar72._0_4_ + auVar66._0_4_;
          auVar195._4_4_ = auVar72._4_4_ + auVar66._4_4_;
          auVar195._8_4_ = auVar72._8_4_ + auVar66._8_4_;
          auVar195._12_4_ = auVar72._12_4_ + auVar66._12_4_;
          auVar253._8_8_ = 0x3f800000;
          auVar253._0_8_ = 0x3f800000;
          auVar72 = vsubps_avx(auVar253,auVar195);
          auVar66 = vsubps_avx(auVar253,auVar267);
          auVar268._0_4_ = fVar76 * auVar123._0_4_;
          auVar268._4_4_ = fVar138 * auVar123._4_4_;
          auVar268._8_4_ = fVar121 * auVar123._8_4_;
          auVar268._12_4_ = fVar156 * auVar123._12_4_;
          fVar157 = auVar206._0_4_;
          auVar232._0_4_ = fVar157 * auVar109._0_4_;
          fVar248 = auVar206._4_4_;
          auVar232._4_4_ = fVar248 * auVar109._4_4_;
          fVar259 = auVar206._8_4_;
          auVar232._8_4_ = fVar259 * auVar109._8_4_;
          fVar260 = auVar206._12_4_;
          auVar232._12_4_ = fVar260 * auVar109._12_4_;
          auVar87._0_4_ = fVar157 * auVar123._0_4_;
          auVar87._4_4_ = fVar248 * auVar123._4_4_;
          auVar87._8_4_ = fVar259 * auVar123._8_4_;
          auVar87._12_4_ = fVar260 * auVar123._12_4_;
          auVar285._0_4_ = fVar76 * auVar72._0_4_;
          auVar285._4_4_ = fVar138 * auVar72._4_4_;
          auVar285._8_4_ = fVar121 * auVar72._8_4_;
          auVar285._12_4_ = fVar156 * auVar72._12_4_;
          auVar244._0_4_ = fVar76 * auVar66._0_4_;
          auVar244._4_4_ = fVar138 * auVar66._4_4_;
          auVar244._8_4_ = fVar121 * auVar66._8_4_;
          auVar244._12_4_ = fVar156 * auVar66._12_4_;
          auVar196._0_4_ = fVar157 * auVar72._0_4_;
          auVar196._4_4_ = fVar248 * auVar72._4_4_;
          auVar196._8_4_ = fVar259 * auVar72._8_4_;
          auVar196._12_4_ = fVar260 * auVar72._12_4_;
          auVar254._0_4_ = fVar157 * auVar66._0_4_;
          auVar254._4_4_ = fVar248 * auVar66._4_4_;
          auVar254._8_4_ = fVar259 * auVar66._8_4_;
          auVar254._12_4_ = fVar260 * auVar66._12_4_;
          auVar72 = vminps_avx(auVar285,auVar244);
          auVar66 = vminps_avx(auVar196,auVar254);
          auVar72 = vminps_avx(auVar72,auVar66);
          auVar66 = vmaxps_avx(auVar244,auVar285);
          auVar206 = vminps_avx(auVar211,auVar268);
          auVar79 = vminps_avx(auVar232,auVar87);
          auVar206 = vminps_avx(auVar206,auVar79);
          auVar72 = vhaddps_avx(auVar72,auVar206);
          auVar206 = vmaxps_avx(auVar254,auVar196);
          auVar66 = vmaxps_avx(auVar206,auVar66);
          auVar206 = vmaxps_avx(auVar268,auVar211);
          auVar79 = vmaxps_avx(auVar87,auVar232);
          auVar206 = vmaxps_avx(auVar79,auVar206);
          auVar66 = vhaddps_avx(auVar66,auVar206);
          auVar206 = vshufps_avx(auVar71,auVar71,0x54);
          auVar206 = vsubps_avx(auVar206,_local_5f8);
          auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
          auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
          auVar212._0_4_ = auVar206._0_4_ + auVar72._0_4_;
          auVar212._4_4_ = auVar206._4_4_ + auVar72._4_4_;
          auVar212._8_4_ = auVar206._8_4_ + auVar72._8_4_;
          auVar212._12_4_ = auVar206._12_4_ + auVar72._12_4_;
          auVar197._0_4_ = auVar206._0_4_ + auVar66._0_4_;
          auVar197._4_4_ = auVar206._4_4_ + auVar66._4_4_;
          auVar197._8_4_ = auVar206._8_4_ + auVar66._8_4_;
          auVar197._12_4_ = auVar206._12_4_ + auVar66._12_4_;
          auVar72 = vmaxps_avx(auVar94,auVar212);
          auVar66 = vminps_avx(auVar197,auVar78);
          auVar72 = vcmpps_avx(auVar66,auVar72,1);
          auVar72 = vshufps_avx(auVar72,auVar72,0x50);
          auVar282 = vinsertps_avx(auVar77,ZEXT416((uint)auVar122._0_4_),0x10);
          if ((auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              -1 < auVar72[0xf]) {
            bVar58 = 0;
            if ((fVar154 < auVar212._0_4_) && (bVar58 = 0, auVar197._0_4_ < auVar78._0_4_)) {
              auVar66 = vmovshdup_avx(auVar212);
              auVar72 = vcmpps_avx(auVar197,auVar78,1);
              bVar58 = auVar72[4] & auVar77._0_4_ < auVar66._0_4_;
            }
            if (((3 < (uint)uVar55 || fVar137 < 0.001) | bVar58) == 1) {
              lVar57 = 200;
              do {
                fVar138 = auVar206._0_4_;
                fVar76 = 1.0 - fVar138;
                fVar137 = fVar76 * fVar76 * fVar76;
                fVar154 = fVar138 * 3.0 * fVar76 * fVar76;
                fVar76 = fVar76 * fVar138 * fVar138 * 3.0;
                auVar150._4_4_ = fVar137;
                auVar150._0_4_ = fVar137;
                auVar150._8_4_ = fVar137;
                auVar150._12_4_ = fVar137;
                auVar102._4_4_ = fVar154;
                auVar102._0_4_ = fVar154;
                auVar102._8_4_ = fVar154;
                auVar102._12_4_ = fVar154;
                auVar88._4_4_ = fVar76;
                auVar88._0_4_ = fVar76;
                auVar88._8_4_ = fVar76;
                auVar88._12_4_ = fVar76;
                fVar138 = fVar138 * fVar138 * fVar138;
                auVar172._0_4_ = (float)local_2e8._0_4_ * fVar138;
                auVar172._4_4_ = (float)local_2e8._4_4_ * fVar138;
                auVar172._8_4_ = fStack_2e0 * fVar138;
                auVar172._12_4_ = fStack_2dc * fVar138;
                auVar72 = vfmadd231ps_fma(auVar172,auVar11,auVar88);
                auVar72 = vfmadd231ps_fma(auVar72,auVar10,auVar102);
                auVar72 = vfmadd231ps_fma(auVar72,auVar9,auVar150);
                auVar89._8_8_ = auVar72._0_8_;
                auVar89._0_8_ = auVar72._0_8_;
                auVar72 = vshufpd_avx(auVar72,auVar72,3);
                auVar66 = vshufps_avx(auVar206,auVar206,0x55);
                auVar72 = vsubps_avx(auVar72,auVar89);
                auVar66 = vfmadd213ps_fma(auVar72,auVar66,auVar89);
                fVar137 = auVar66._0_4_;
                auVar72 = vshufps_avx(auVar66,auVar66,0x55);
                auVar90._0_4_ = fVar155 * fVar137 + fVar93 * auVar72._0_4_;
                auVar90._4_4_ = auVar276._4_4_ * fVar137 + auVar67._4_4_ * auVar72._4_4_;
                auVar90._8_4_ = auVar276._8_4_ * fVar137 + auVar67._8_4_ * auVar72._8_4_;
                auVar90._12_4_ = auVar276._12_4_ * fVar137 + auVar67._12_4_ * auVar72._12_4_;
                auVar206 = vsubps_avx(auVar206,auVar90);
                auVar72 = vandps_avx(auVar186,auVar66);
                auVar66 = vshufps_avx(auVar72,auVar72,0xf5);
                auVar72 = vmaxss_avx(auVar66,auVar72);
                if (auVar72._0_4_ < fVar75) {
                  local_218 = auVar206._0_4_;
                  if (0.0 <= local_218) {
                    auVar287 = ZEXT1664(auVar282);
                    if (local_218 <= 1.0) {
                      auVar72 = vmovshdup_avx(auVar206);
                      fVar137 = auVar72._0_4_;
                      if ((0.0 <= fVar137) && (fVar137 <= 1.0)) {
                        auVar72 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar109 = vinsertps_avx(auVar72,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar72 = vdpps_avx(auVar109,local_488,0x7f);
                        auVar276 = vdpps_avx(auVar109,local_498,0x7f);
                        auVar67 = vdpps_avx(auVar109,local_2f8,0x7f);
                        auVar66 = vdpps_avx(auVar109,local_308,0x7f);
                        auVar94 = vdpps_avx(auVar109,local_318,0x7f);
                        auVar78 = vdpps_avx(auVar109,local_328,0x7f);
                        auVar79 = vdpps_avx(auVar109,local_338,0x7f);
                        auVar109 = vdpps_avx(auVar109,local_348,0x7f);
                        fVar154 = 1.0 - fVar137;
                        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * auVar94._0_4_)),
                                                  ZEXT416((uint)fVar154),auVar72);
                        auVar276 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * fVar137)),
                                                   ZEXT416((uint)fVar154),auVar276);
                        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar137)),
                                                  ZEXT416((uint)fVar154),auVar67);
                        auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * auVar109._0_4_)),
                                                  ZEXT416((uint)fVar154),auVar66);
                        fVar93 = 1.0 - local_218;
                        fVar137 = fVar93 * local_218 * local_218 * 3.0;
                        fVar138 = local_218 * local_218 * local_218;
                        auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar138)),
                                                  ZEXT416((uint)fVar137),auVar67);
                        fVar154 = local_218 * 3.0 * fVar93 * fVar93;
                        auVar276 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar154),auVar276);
                        fVar155 = fVar93 * fVar93 * fVar93;
                        auVar72 = vfmadd231ss_fma(auVar276,ZEXT416((uint)fVar155),auVar72);
                        fVar76 = auVar72._0_4_;
                        if ((fVar64 <= fVar76) &&
                           (fVar121 = *(float *)(ray + k * 4 + 0x80), fVar76 <= fVar121)) {
                          pGVar4 = (context->scene->geometries).items[uVar51].ptr;
                          if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar63 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar63 = true,
                                  pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_208 = vshufps_avx(auVar206,auVar206,0x55);
                            auVar213._8_4_ = 0x3f800000;
                            auVar213._0_8_ = &DAT_3f8000003f800000;
                            auVar213._12_4_ = 0x3f800000;
                            auVar72 = vsubps_avx(auVar213,local_208);
                            fVar156 = local_208._0_4_;
                            auVar225._0_4_ = fVar156 * (float)local_4b8._0_4_;
                            fVar157 = local_208._4_4_;
                            auVar225._4_4_ = fVar157 * (float)local_4b8._4_4_;
                            fVar248 = local_208._8_4_;
                            auVar225._8_4_ = fVar248 * fStack_4b0;
                            fVar259 = local_208._12_4_;
                            auVar225._12_4_ = fVar259 * fStack_4ac;
                            auVar233._0_4_ = fVar156 * (float)local_4f8._0_4_;
                            auVar233._4_4_ = fVar157 * (float)local_4f8._4_4_;
                            auVar233._8_4_ = fVar248 * fStack_4f0;
                            auVar233._12_4_ = fVar259 * fStack_4ec;
                            auVar245._0_4_ = fVar156 * (float)local_508._0_4_;
                            auVar245._4_4_ = fVar157 * (float)local_508._4_4_;
                            auVar245._8_4_ = fVar248 * fStack_500;
                            auVar245._12_4_ = fVar259 * fStack_4fc;
                            auVar255._0_4_ = fVar156 * fVar158;
                            auVar255._4_4_ = fVar157 * fVar177;
                            auVar255._8_4_ = fVar248 * fVar179;
                            auVar255._12_4_ = fVar259 * fVar181;
                            auVar276 = vfmadd231ps_fma(auVar225,auVar72,local_4a8);
                            auVar67 = vfmadd231ps_fma(auVar233,auVar72,local_4d8);
                            auVar66 = vfmadd231ps_fma(auVar245,auVar72,local_4e8);
                            auVar94 = vfmadd231ps_fma(auVar255,auVar72,local_4c8);
                            auVar72 = vsubps_avx(auVar67,auVar276);
                            auVar276 = vsubps_avx(auVar66,auVar67);
                            auVar67 = vsubps_avx(auVar94,auVar66);
                            auVar246._0_4_ = auVar276._0_4_ * local_218;
                            auVar246._4_4_ = auVar276._4_4_ * local_218;
                            auVar246._8_4_ = auVar276._8_4_ * local_218;
                            auVar246._12_4_ = auVar276._12_4_ * local_218;
                            auVar173._4_4_ = fVar93;
                            auVar173._0_4_ = fVar93;
                            auVar173._8_4_ = fVar93;
                            auVar173._12_4_ = fVar93;
                            auVar72 = vfmadd231ps_fma(auVar246,auVar173,auVar72);
                            auVar214._0_4_ = auVar67._0_4_ * local_218;
                            auVar214._4_4_ = auVar67._4_4_ * local_218;
                            auVar214._8_4_ = auVar67._8_4_ * local_218;
                            auVar214._12_4_ = auVar67._12_4_ * local_218;
                            auVar276 = vfmadd231ps_fma(auVar214,auVar173,auVar276);
                            auVar215._0_4_ = auVar276._0_4_ * local_218;
                            auVar215._4_4_ = auVar276._4_4_ * local_218;
                            auVar215._8_4_ = auVar276._8_4_ * local_218;
                            auVar215._12_4_ = auVar276._12_4_ * local_218;
                            auVar276 = vfmadd231ps_fma(auVar215,auVar173,auVar72);
                            auVar151._0_4_ = fVar138 * (float)local_3c8._0_4_;
                            auVar151._4_4_ = fVar138 * (float)local_3c8._4_4_;
                            auVar151._8_4_ = fVar138 * fStack_3c0;
                            auVar151._12_4_ = fVar138 * fStack_3bc;
                            auVar103._4_4_ = fVar137;
                            auVar103._0_4_ = fVar137;
                            auVar103._8_4_ = fVar137;
                            auVar103._12_4_ = fVar137;
                            auVar72 = vfmadd132ps_fma(auVar103,auVar151,local_3b8);
                            auVar133._4_4_ = fVar154;
                            auVar133._0_4_ = fVar154;
                            auVar133._8_4_ = fVar154;
                            auVar133._12_4_ = fVar154;
                            auVar72 = vfmadd132ps_fma(auVar133,auVar72,local_3a8);
                            auVar104._0_4_ = auVar276._0_4_ * 3.0;
                            auVar104._4_4_ = auVar276._4_4_ * 3.0;
                            auVar104._8_4_ = auVar276._8_4_ * 3.0;
                            auVar104._12_4_ = auVar276._12_4_ * 3.0;
                            auVar117._4_4_ = fVar155;
                            auVar117._0_4_ = fVar155;
                            auVar117._8_4_ = fVar155;
                            auVar117._12_4_ = fVar155;
                            auVar276 = vfmadd132ps_fma(auVar117,auVar72,local_398);
                            auVar72 = vshufps_avx(auVar104,auVar104,0xc9);
                            auVar134._0_4_ = auVar276._0_4_ * auVar72._0_4_;
                            auVar134._4_4_ = auVar276._4_4_ * auVar72._4_4_;
                            auVar134._8_4_ = auVar276._8_4_ * auVar72._8_4_;
                            auVar134._12_4_ = auVar276._12_4_ * auVar72._12_4_;
                            auVar72 = vshufps_avx(auVar276,auVar276,0xc9);
                            auVar276 = vfmsub231ps_fma(auVar134,auVar104,auVar72);
                            auVar72 = vshufps_avx(auVar276,auVar276,0x55);
                            local_248[0] = (RTCHitN)auVar72[0];
                            local_248[1] = (RTCHitN)auVar72[1];
                            local_248[2] = (RTCHitN)auVar72[2];
                            local_248[3] = (RTCHitN)auVar72[3];
                            local_248[4] = (RTCHitN)auVar72[4];
                            local_248[5] = (RTCHitN)auVar72[5];
                            local_248[6] = (RTCHitN)auVar72[6];
                            local_248[7] = (RTCHitN)auVar72[7];
                            local_248[8] = (RTCHitN)auVar72[8];
                            local_248[9] = (RTCHitN)auVar72[9];
                            local_248[10] = (RTCHitN)auVar72[10];
                            local_248[0xb] = (RTCHitN)auVar72[0xb];
                            local_248[0xc] = (RTCHitN)auVar72[0xc];
                            local_248[0xd] = (RTCHitN)auVar72[0xd];
                            local_248[0xe] = (RTCHitN)auVar72[0xe];
                            local_248[0xf] = (RTCHitN)auVar72[0xf];
                            local_238 = vshufps_avx(auVar276,auVar276,0xaa);
                            local_228 = auVar276._0_4_;
                            uStack_224 = local_228;
                            uStack_220 = local_228;
                            uStack_21c = local_228;
                            fStack_214 = local_218;
                            fStack_210 = local_218;
                            fStack_20c = local_218;
                            local_1f8 = CONCAT44(uStack_384,local_388);
                            uStack_1f0 = CONCAT44(uStack_37c,uStack_380);
                            local_1e8._4_4_ = uStack_374;
                            local_1e8._0_4_ = local_378;
                            local_1e8._8_4_ = uStack_370;
                            local_1e8._12_4_ = uStack_36c;
                            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                            uStack_1d4 = context->user->instID[0];
                            local_1d8 = uStack_1d4;
                            uStack_1d0 = uStack_1d4;
                            uStack_1cc = uStack_1d4;
                            uStack_1c8 = context->user->instPrimID[0];
                            uStack_1c4 = uStack_1c8;
                            uStack_1c0 = uStack_1c8;
                            uStack_1bc = uStack_1c8;
                            *(float *)(ray + k * 4 + 0x80) = fVar76;
                            local_528 = *local_510;
                            uStack_520 = local_510[1];
                            local_3f8.valid = (int *)&local_528;
                            local_3f8.geometryUserPtr = pGVar4->userPtr;
                            local_3f8.context = context->user;
                            local_3f8.ray = (RTCRayN *)ray;
                            local_3f8.hit = local_248;
                            local_3f8.N = 4;
                            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar4->occlusionFilterN)(&local_3f8);
                            }
                            auVar46._8_8_ = uStack_520;
                            auVar46._0_8_ = local_528;
                            if (auVar46 == (undefined1  [16])0x0) {
                              auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                              auVar72 = auVar72 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var5 = context->args->filter;
                              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var5)(&local_3f8);
                              }
                              auVar47._8_8_ = uStack_520;
                              auVar47._0_8_ = local_528;
                              auVar276 = vpcmpeqd_avx((undefined1  [16])0x0,auVar47);
                              auVar72 = auVar276 ^ _DAT_01febe20;
                              auVar105._8_4_ = 0xff800000;
                              auVar105._0_8_ = 0xff800000ff800000;
                              auVar105._12_4_ = 0xff800000;
                              auVar276 = vblendvps_avx(auVar105,*(undefined1 (*) [16])
                                                                 (local_3f8.ray + 0x80),auVar276);
                              *(undefined1 (*) [16])(local_3f8.ray + 0x80) = auVar276;
                            }
                            auVar72 = vpslld_avx(auVar72,0x1f);
                            iVar54 = vmovmskps_avx(auVar72);
                            if (iVar54 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar121;
                            }
                            bVar63 = (char)iVar54 != '\0';
                          }
                          auVar287 = ZEXT1664(auVar282);
                          bVar61 = (bool)(bVar61 | bVar63);
                        }
                      }
                    }
                    goto LAB_016838ec;
                  }
                  break;
                }
                lVar57 = lVar57 + -1;
              } while (lVar57 != 0);
            }
            else {
              bVar41 = false;
            }
          }
        }
      }
      auVar287 = ZEXT1664(auVar282);
LAB_016838ec:
    } while (bVar41);
    local_358 = vinsertps_avx(auVar8,ZEXT416((uint)fVar153),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }